

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_bolelli_2019.h
# Opt level: O3

void __thiscall Spaghetti<TTA>::FirstScan(Spaghetti<TTA> *this)

{
  long lVar1;
  long lVar2;
  char cVar3;
  Mat1b *pMVar4;
  Mat1i *pMVar5;
  uint *puVar6;
  uint *puVar7;
  uint *puVar8;
  uint *puVar9;
  uint *puVar10;
  uint uVar11;
  uint uVar12;
  long lVar13;
  long lVar14;
  ulong uVar15;
  ulong uVar16;
  undefined4 uVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  int iVar21;
  uint uVar22;
  long lVar23;
  long lVar24;
  long lVar25;
  long lVar26;
  long lVar27;
  long lVar28;
  uint uVar29;
  long lVar30;
  int iVar31;
  long lVar32;
  long lVar33;
  long lVar34;
  long lVar35;
  long lVar36;
  long lVar37;
  long lVar38;
  long lVar39;
  long lVar40;
  ulong uVar41;
  int iVar42;
  long lVar43;
  long lVar44;
  long lVar45;
  long lVar46;
  ulong uVar47;
  long lVar48;
  long lVar49;
  long lVar50;
  ulong local_d8;
  int local_b0;
  ulong local_a8;
  
  pMVar4 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
  uVar12 = *(uint *)&pMVar4->field_0x8;
  uVar22 = *(uint *)&pMVar4->field_0xc;
  *(uint *)&(this->super_Labeling2D<(Connectivity2D)8,_false>).field_0x74 = uVar12 & 0xfffffffe;
  this->o_rows = (uVar12 & 0x80000001) == 1;
  this->e_cols = uVar22 & 0xfffffffe;
  this->o_cols = (uVar22 & 0x80000001) == 1;
  puVar6 = TTA::rtable_;
  *TTA::rtable_ = 0;
  puVar9 = TTA::tail_;
  puVar7 = TTA::next_;
  TTA::length_ = 1;
  lVar30 = *(long *)&pMVar4->field_0x10;
  if (uVar12 == 1) {
    lVar37 = *(long *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->field_0x10;
    uVar29 = uVar22 - 2;
    uVar12 = 0;
    if (2 < (int)uVar22) {
      uVar22 = 0xfffffffe;
      uVar16 = 0;
LAB_00187db6:
      uVar12 = (uint)uVar16;
      if (*(char *)(lVar30 + (int)uVar12) == '\0') goto LAB_00187df7;
      cVar3 = *(char *)(lVar30 + 3 + (long)(int)uVar22);
      uVar41 = (ulong)TTA::length_;
      puVar6[uVar41] = TTA::length_;
      puVar7[uVar41] = 0xffffffff;
      puVar9[TTA::length_] = TTA::length_;
      uVar22 = TTA::length_ + 1;
      *(uint *)(lVar37 + (long)(int)uVar12 * 4) = TTA::length_;
      TTA::length_ = uVar22;
      uVar22 = uVar12;
      if (cVar3 == '\0') goto LAB_00187e82;
      while( true ) {
        uVar22 = (int)uVar16 + 2;
        if ((int)uVar29 <= (int)uVar22) break;
        uVar41 = (long)(int)uVar16;
        while (*(char *)(lVar30 + 2 + uVar41) != '\0') {
          if (*(char *)(lVar30 + 3 + uVar41) == '\0') {
            uVar17 = *(undefined4 *)(lVar37 + uVar41 * 4);
            lVar34 = uVar41 + 2;
            goto LAB_00187e7e;
          }
          *(undefined4 *)(lVar37 + 8 + uVar41 * 4) = *(undefined4 *)(lVar37 + uVar41 * 4);
          uVar16 = uVar41 + 2;
          uVar22 = uVar22 + 2;
          lVar34 = uVar41 + 4;
          uVar41 = uVar16;
          if ((long)(ulong)uVar29 <= lVar34) goto LAB_001881cb;
        }
        uVar16 = (ulong)uVar22;
LAB_00187df7:
        uVar22 = (uint)uVar16;
        lVar34 = (long)(int)uVar22;
        if (*(char *)(lVar30 + 1 + lVar34) == '\0') goto LAB_00187e6c;
        uVar41 = (ulong)TTA::length_;
        puVar6[uVar41] = TTA::length_;
        puVar7[uVar41] = 0xffffffff;
        puVar9[TTA::length_] = TTA::length_;
        uVar12 = TTA::length_ + 1;
        *(uint *)(lVar37 + lVar34 * 4) = TTA::length_;
        TTA::length_ = uVar12;
      }
LAB_001881cb:
      lVar34 = (long)(int)uVar22;
      if ((int)uVar29 < (int)uVar22) {
        if (*(char *)(lVar30 + lVar34) == '\0') goto LAB_001882fc;
      }
      else if (*(char *)(lVar30 + lVar34) == '\0') goto LAB_001882b5;
      *(undefined4 *)(lVar37 + lVar34 * 4) = *(undefined4 *)(lVar37 + (long)(int)uVar16 * 4);
      return;
    }
LAB_00187e91:
    lVar34 = (long)(int)uVar12;
    cVar3 = *(char *)(lVar30 + lVar34);
    if ((int)uVar12 <= (int)uVar29) {
      if (cVar3 != '\0') goto LAB_001882bd;
LAB_001882b5:
      cVar3 = *(char *)(lVar30 + 1 + lVar34);
    }
    if (cVar3 == '\0') {
LAB_001882fc:
      *(undefined4 *)(lVar37 + lVar34 * 4) = 0;
      return;
    }
LAB_001882bd:
    uVar16 = (ulong)TTA::length_;
    puVar6[uVar16] = TTA::length_;
    TTA::next_[uVar16] = 0xffffffff;
    TTA::tail_[TTA::length_] = TTA::length_;
    uVar12 = TTA::length_ + 1;
    *(uint *)(lVar37 + lVar34 * 4) = TTA::length_;
    TTA::length_ = uVar12;
    return;
  }
  lVar34 = **(long **)&pMVar4->field_0x48;
  lVar37 = lVar30 + lVar34;
  lVar49 = *(long *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->field_0x10;
  uVar16 = (long)(int)uVar22 - 2;
  uVar41 = 0;
  local_b0 = (int)uVar16;
  if (2 < (int)uVar22) {
    uVar41 = 0;
    do {
      lVar24 = (long)(int)uVar41;
      if (*(char *)(lVar30 + lVar24) != '\0') goto LAB_0018810f;
      if (*(char *)(lVar37 + lVar24) != '\0') goto LAB_0018810f;
LAB_00187f55:
      iVar31 = (int)uVar41;
      uVar47 = (ulong)iVar31;
      if ((*(char *)(uVar47 + 1 + lVar30) != '\0') || (*(char *)(lVar37 + 1 + uVar47) != '\0')) {
        uVar15 = (ulong)TTA::length_;
        puVar6[uVar15] = TTA::length_;
        puVar7[uVar15] = 0xffffffff;
        uVar15 = (ulong)TTA::length_;
        puVar9[uVar15] = TTA::length_;
        TTA::length_ = TTA::length_ + 1;
LAB_00187f9a:
        *(int *)(lVar49 + uVar47 * 4) = (int)uVar15;
LAB_00187fba:
        lVar24 = (long)(int)uVar41;
        uVar41 = lVar24 + 2;
        if ((int)uVar41 < local_b0) {
          if ((*(char *)(lVar30 + uVar41) != '\0') || (*(char *)(lVar37 + uVar41) != '\0')) {
LAB_00187fde:
            lVar24 = (long)(int)uVar41;
            cVar3 = *(char *)(lVar30 + 1 + lVar24);
            *(undefined4 *)(lVar49 + lVar24 * 4) = *(undefined4 *)(lVar49 + -8 + lVar24 * 4);
            if (cVar3 == '\0') {
              do {
                puVar10 = TTA::tail_;
                puVar8 = TTA::next_;
                iVar31 = (int)uVar41;
                uVar29 = iVar31 + 2;
                if (local_b0 <= (int)uVar29) {
LAB_001881fc:
                  uVar41 = (ulong)(int)uVar29;
                  uVar47 = uVar41;
                  if (local_b0 < (int)uVar29) {
                    if ((*(char *)(lVar30 + uVar41) == '\0') && (*(char *)(lVar37 + uVar41) == '\0')
                       ) goto LAB_0018821e;
                  }
                  else {
                    if (*(char *)(lVar30 + uVar41) != '\0') {
                      if (*(char *)(lVar37 + 1 + (long)iVar31) != '\0') goto LAB_0018839b;
                      goto LAB_00188276;
                    }
                    if (*(char *)(lVar37 + uVar41) == '\0') {
                      uVar41 = (ulong)uVar29;
                      goto LAB_001883a9;
                    }
                  }
                  if (*(char *)(lVar37 + 1 + (long)iVar31) == '\0') {
                    uVar41 = (ulong)TTA::length_;
                    puVar6[uVar41] = TTA::length_;
                    TTA::next_[uVar41] = 0xffffffff;
                    TTA::tail_[TTA::length_] = TTA::length_;
                    uVar11 = TTA::length_ + 1;
                    *(uint *)(lVar49 + (long)(int)uVar29 * 4) = TTA::length_;
                    TTA::length_ = uVar11;
                  }
                  else {
                    *(undefined4 *)(lVar49 + (long)(int)uVar29 * 4) =
                         *(undefined4 *)(lVar49 + (long)iVar31 * 4);
                  }
                  goto LAB_001883fa;
                }
                lVar25 = (long)iVar31;
                lVar1 = lVar25 + 2;
                lVar24 = lVar49 + lVar25 * 4;
                lVar19 = lVar30 + 2 + lVar34 + lVar25;
                lVar45 = lVar30 + 2 + lVar25;
                lVar25 = lVar25 << 0x20;
                lVar35 = 0;
                while (*(char *)(lVar45 + lVar35) == '\0') {
                  if (*(char *)(lVar19 + lVar35) == '\0') {
                    uVar41 = (ulong)(uint)((int)lVar1 + (int)lVar35);
                    goto LAB_00187f55;
                  }
                  if (*(char *)(lVar45 + 1 + lVar35) != '\0') {
                    uVar47 = lVar1 + lVar35;
                    if (*(char *)(lVar35 + -1 + lVar19) == '\0') {
                      uVar41 = (ulong)TTA::length_;
                      puVar6[uVar41] = TTA::length_;
                      puVar7[uVar41] = 0xffffffff;
                      uVar15 = (ulong)TTA::length_;
                      puVar9[uVar15] = TTA::length_;
                      TTA::length_ = TTA::length_ + 1;
                    }
                    else {
                      uVar15 = (ulong)*(uint *)(lVar24 + lVar35 * 4);
                    }
                    uVar41 = uVar47 & 0xffffffff;
                    goto LAB_00187f9a;
                  }
                  if (*(char *)(lVar19 + -1 + lVar35) == '\0') {
                    uVar41 = (ulong)TTA::length_;
                    puVar6[uVar41] = TTA::length_;
                    puVar8[uVar41] = 0xffffffff;
                    puVar10[TTA::length_] = TTA::length_;
                    uVar29 = TTA::length_;
                    TTA::length_ = TTA::length_ + 1;
                  }
                  else {
                    uVar29 = *(uint *)(lVar24 + lVar35 * 4);
                  }
                  *(uint *)(lVar24 + 8 + lVar35 * 4) = uVar29;
                  lVar25 = lVar25 + 0x200000000;
                  lVar2 = lVar35 + lVar1;
                  lVar35 = lVar35 + 2;
                  if ((long)(uVar16 & 0xffffffff) <= lVar2 + 2) {
                    uVar29 = iVar31 + (int)lVar35 + 2;
                    iVar31 = iVar31 + (int)lVar35;
                    goto LAB_001881fc;
                  }
                }
                if (*(char *)(lVar37 + 1 + (lVar25 >> 0x20)) != '\0') goto code_r0x001880c9;
                lVar24 = lVar25 + 0x200000000 >> 0x20;
                uVar41 = lVar1 + lVar35 & 0xffffffff;
LAB_0018810f:
                cVar3 = *(char *)(lVar30 + 1 + lVar24);
                uVar47 = (ulong)TTA::length_;
                puVar6[uVar47] = TTA::length_;
                puVar7[uVar47] = 0xffffffff;
                puVar9[TTA::length_] = TTA::length_;
                uVar29 = TTA::length_ + 1;
                *(uint *)(lVar49 + lVar24 * 4) = TTA::length_;
                TTA::length_ = uVar29;
                if (cVar3 != '\0') break;
              } while( true );
            }
            goto LAB_00187fba;
          }
          goto LAB_00187f55;
        }
        if (local_b0 < (int)uVar41) {
          if ((*(char *)(lVar30 + uVar41) == '\0') && (*(char *)(lVar37 + uVar41) == '\0')) {
            *(undefined4 *)(lVar49 + 8 + lVar24 * 4) = 0;
          }
          else {
            *(undefined4 *)(lVar49 + 8 + lVar24 * 4) = *(undefined4 *)(lVar49 + lVar24 * 4);
          }
        }
        else {
          if ((*(char *)(lVar30 + uVar41) == '\0') && (*(char *)(lVar37 + uVar41) == '\0'))
          goto LAB_001883a9;
LAB_0018839b:
          *(undefined4 *)(lVar49 + uVar41 * 4) = *(undefined4 *)(lVar49 + -8 + uVar41 * 4);
        }
        goto LAB_001883fa;
      }
      *(undefined4 *)(lVar49 + (long)iVar31 * 4) = 0;
      uVar41 = (ulong)(iVar31 + 2U);
    } while ((int)(iVar31 + 2U) < local_b0);
  }
  uVar47 = (ulong)(int)uVar41;
  if (local_b0 < (int)uVar41) {
    if ((*(char *)(lVar30 + uVar47) == '\0') && (*(char *)(lVar37 + uVar47) == '\0')) {
LAB_0018821e:
      *(undefined4 *)(lVar49 + uVar47 * 4) = 0;
    }
    else {
LAB_00188276:
      uVar41 = (ulong)TTA::length_;
      puVar6[uVar41] = TTA::length_;
      TTA::next_[uVar41] = 0xffffffff;
      TTA::tail_[TTA::length_] = TTA::length_;
      uVar29 = TTA::length_ + 1;
      *(uint *)(lVar49 + uVar47 * 4) = TTA::length_;
      TTA::length_ = uVar29;
    }
  }
  else {
    if ((*(char *)(lVar30 + uVar47) != '\0') || (*(char *)(lVar37 + uVar47) != '\0'))
    goto LAB_00188276;
LAB_001883a9:
    lVar34 = (long)(int)uVar41;
    if ((*(char *)(lVar34 + 1 + lVar30) == '\0') && (*(char *)(lVar37 + 1 + lVar34) == '\0')) {
      *(undefined4 *)(lVar49 + lVar34 * 4) = 0;
    }
    else {
      uVar41 = (ulong)TTA::length_;
      puVar6[uVar41] = TTA::length_;
      TTA::next_[uVar41] = 0xffffffff;
      TTA::tail_[TTA::length_] = TTA::length_;
      uVar29 = TTA::length_ + 1;
      *(uint *)(lVar49 + lVar34 * 4) = TTA::length_;
      TTA::length_ = uVar29;
    }
  }
LAB_001883fa:
  if (*(int *)&(this->super_Labeling2D<(Connectivity2D)8,_false>).field_0x74 < 3) {
    if ((uVar12 & 0x80000001) != 1) {
      return;
    }
  }
  else {
    lVar37 = 2;
    lVar34 = 1;
    lVar30 = 3;
    lVar49 = 0;
    do {
      pMVar4 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
      pMVar5 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_;
      lVar45 = *(long *)&pMVar4->field_0x10;
      lVar25 = **(long **)&pMVar4->field_0x48;
      lVar36 = lVar25 * lVar37;
      lVar24 = lVar45 + lVar36;
      lVar32 = lVar24 - lVar25;
      lVar1 = lVar24 + lVar25;
      lVar35 = *(long *)&pMVar5->field_0x10;
      lVar2 = **(long **)&pMVar5->field_0x48;
      lVar13 = lVar2 * lVar37;
      lVar19 = lVar35 + lVar13;
      lVar43 = lVar19 + lVar2 * -2;
      cVar3 = *(char *)(lVar45 + lVar36);
      if (2 < (int)uVar22) {
        lVar40 = lVar32 - lVar25;
        local_d8 = 0;
        uVar41 = 0;
        if (cVar3 == '\0') goto LAB_001885a6;
LAB_001884dd:
        iVar31 = (int)local_d8;
        lVar50 = (long)iVar31;
        if (*(char *)(lVar50 + 1 + lVar32) == '\0') {
          uVar41 = local_d8;
          if (*(char *)(lVar24 + 1 + lVar50) != '\0') goto LAB_00188604;
          if (*(char *)(lVar32 + lVar50) == '\0') {
            uVar41 = (ulong)TTA::length_;
            TTA::rtable_[uVar41] = TTA::length_;
            TTA::next_[uVar41] = 0xffffffff;
            TTA::tail_[TTA::length_] = TTA::length_;
            uVar29 = TTA::length_ + 1;
            *(uint *)(lVar19 + lVar50 * 4) = TTA::length_;
            TTA::length_ = uVar29;
            goto LAB_00188a84;
          }
          *(undefined4 *)(lVar19 + lVar50 * 4) = *(undefined4 *)(lVar43 + lVar50 * 4);
          goto LAB_00189716;
        }
        *(undefined4 *)(lVar19 + lVar50 * 4) = *(undefined4 *)(lVar43 + lVar50 * 4);
LAB_0018af8c:
        do {
          iVar31 = (int)local_d8;
          uVar29 = iVar31 + 2;
          if (local_b0 <= (int)uVar29) {
LAB_0018b0e8:
            local_d8 = (ulong)uVar29;
            if (local_b0 < (int)uVar29) {
              if (*(char *)(lVar24 + local_d8) == '\0') {
                if (*(char *)(lVar1 + local_d8) == '\0') goto LAB_0018a0cc;
LAB_0018b25b:
                if ((*(char *)(lVar1 + (ulong)(iVar31 + 1)) == '\0') &&
                   (*(char *)(lVar24 + (ulong)(iVar31 + 1)) == '\0')) goto LAB_0018b27b;
              }
              else if ((*(char *)(lVar24 + (ulong)(iVar31 + 1)) == '\0') &&
                      (*(char *)(lVar1 + (ulong)(iVar31 + 1)) == '\0')) goto LAB_0018b4d5;
              lVar45 = (long)iVar31;
            }
            else {
              if (*(char *)(lVar24 + local_d8) != '\0') {
                if ((*(char *)(lVar24 + (ulong)(iVar31 + 1)) == '\0') &&
                   (*(char *)(lVar1 + (ulong)(iVar31 + 1)) == '\0')) {
                  if (*(char *)(lVar32 + 3 + (long)iVar31) == '\0') {
LAB_0018b4d5:
                    if (*(char *)(lVar32 + local_d8) != '\0') goto LAB_0018851e;
                    uVar17 = *(undefined4 *)(lVar43 + (long)iVar31 * 4);
                    goto LAB_0018b274;
                  }
                  if (*(char *)(lVar32 + local_d8) != '\0') goto LAB_0018851e;
                  local_d8 = (ulong)(int)uVar29;
LAB_0018b169:
                  if (*(char *)(lVar40 + local_d8) == '\0') {
                    uVar29 = *(uint *)(lVar43 + -8 + local_d8 * 4);
                    uVar11 = *(uint *)(lVar43 + local_d8 * 4);
LAB_0018a111:
                    uVar29 = TTA::Merge(uVar29,uVar11);
                  }
                  else {
LAB_0018b179:
                    uVar29 = *(uint *)(lVar43 + local_d8 * 4);
                  }
LAB_0018b17d:
                  *(uint *)(lVar19 + local_d8 * 4) = uVar29;
                  goto LAB_0018b2bb;
                }
LAB_0018b1f8:
                lVar24 = (long)(int)uVar29;
                if (*(char *)(lVar32 + 1 + lVar24) == '\0') {
                  uVar29 = *(uint *)(lVar19 + -8 + lVar24 * 4);
                }
                else {
LAB_0018b202:
                  if (*(char *)(lVar32 + lVar24) == '\0') {
                    cVar3 = *(char *)(lVar40 + lVar24);
LAB_0018b21e:
                    uVar29 = *(uint *)(lVar43 + lVar24 * 4);
                    if (cVar3 != '\0') {
                      *(uint *)(lVar19 + lVar24 * 4) = uVar29;
                      goto LAB_0018b2bb;
                    }
LAB_0018b22e:
                    uVar29 = TTA::Merge(uVar29,*(uint *)(lVar19 + -8 + lVar24 * 4));
                  }
                  else {
                    uVar29 = *(uint *)(lVar43 + lVar24 * 4);
                  }
                }
                *(uint *)(lVar19 + lVar24 * 4) = uVar29;
                goto LAB_0018b2bb;
              }
              if (*(char *)(lVar1 + local_d8) == '\0') {
LAB_0018b4ce:
                uVar41 = (ulong)uVar29;
                goto LAB_00188871;
              }
              if (*(char *)(lVar24 + (ulong)(iVar31 + 3)) == '\0') goto LAB_0018b25b;
              if (*(char *)(lVar24 + (ulong)(iVar31 + 1)) != '\0') goto LAB_0018b1f8;
              if (*(char *)(lVar1 + (ulong)(iVar31 + 1)) == '\0') goto LAB_0018849e;
              if (*(char *)(lVar32 + (ulong)(iVar31 + 3)) != '\0') {
                lVar24 = (long)(int)uVar29;
                goto LAB_0018b202;
              }
              if (*(char *)(lVar32 + local_d8) != '\0') goto LAB_0018851e;
              lVar45 = (long)iVar31;
            }
LAB_0018b26f:
            uVar17 = *(undefined4 *)(lVar19 + lVar45 * 4);
            goto LAB_0018b274;
          }
          lVar26 = (long)iVar31;
          lVar50 = lVar26 + 2;
          lVar38 = lVar25 * lVar30 + lVar26;
          lVar33 = lVar25 * lVar34 + lVar26;
          lVar46 = lVar2 * lVar49 + lVar26 * 4;
          lVar48 = lVar13 + lVar26 * 4;
          lVar27 = lVar26 << 0x20;
          lVar20 = lVar45 + lVar36 + lVar26;
          lVar23 = lVar45 + 2 + lVar33;
          lVar39 = lVar35 + lVar46 + 8;
          lVar18 = lVar35 + lVar48 + 8;
          lVar14 = 0;
          while( true ) {
            lVar28 = lVar27 >> 0x1e;
            lVar44 = lVar27 >> 0x20;
            if (*(char *)(lVar20 + 2 + lVar14) == '\0') goto LAB_0018b2e2;
            iVar21 = (int)lVar50;
            if ((*(char *)(lVar20 + 1 + lVar14) != '\0') ||
               (*(char *)(lVar45 + lVar38 + 1 + lVar14) != '\0')) {
              local_d8 = (ulong)(uint)(iVar21 + (int)lVar14);
              goto LAB_0018a626;
            }
            if (*(char *)(lVar23 + 1 + lVar14) == '\0') {
              local_d8 = lVar50 + lVar14;
              iVar31 = (int)local_d8;
              if (*(char *)(lVar14 + 3 + lVar36 + lVar26 + lVar45) == '\0') {
                if (*(char *)(lVar14 + 2 + lVar33 + lVar45) == '\0') {
                  *(undefined4 *)(lVar48 + lVar35 + 8 + lVar14 * 4) =
                       *(undefined4 *)(lVar43 + lVar28);
                  goto LAB_00188a84;
                }
                *(undefined4 *)(lVar18 + lVar14 * 4) = *(undefined4 *)(lVar39 + lVar14 * 4);
                goto LAB_00189716;
              }
              cVar3 = *(char *)(lVar14 + 2 + lVar33 + lVar45);
              if (*(char *)(lVar32 + 4 + lVar44) != '\0') {
                if (cVar3 != '\0') goto LAB_0018861f;
                uVar47 = lVar27 + 0x200000000 >> 0x20;
                goto LAB_0018b6cd;
              }
              if (cVar3 != '\0') {
                *(undefined4 *)(lVar18 + lVar14 * 4) =
                     *(undefined4 *)(lVar46 + lVar35 + 8 + lVar14 * 4);
                goto LAB_0018b5e9;
              }
              *(undefined4 *)(lVar18 + lVar14 * 4) = *(undefined4 *)(lVar43 + lVar44 * 4);
              goto LAB_0018b7ba;
            }
            if (*(char *)(lVar23 + lVar14) == '\0') break;
            *(undefined4 *)(lVar18 + lVar14 * 4) = *(undefined4 *)(lVar39 + lVar14 * 4);
            lVar27 = lVar27 + 0x200000000;
            lVar44 = lVar50 + lVar14;
            lVar14 = lVar14 + 2;
            if ((long)uVar16 <= lVar44 + 2) {
              iVar31 = iVar31 + (int)lVar14;
              uVar29 = iVar21 + (int)lVar14;
              goto LAB_0018b0e8;
            }
          }
          local_d8 = (ulong)(uint)(iVar21 + (int)lVar14);
          lVar50 = lVar27 + 0x200000000 >> 0x20;
LAB_0018b450:
          if (*(char *)(lVar40 + lVar50) == '\0') {
            uVar29 = TTA::Merge(*(uint *)(lVar43 + -8 + lVar50 * 4),*(uint *)(lVar43 + lVar50 * 4));
          }
          else {
            uVar29 = *(uint *)(lVar43 + lVar50 * 4);
          }
          *(uint *)(lVar19 + lVar50 * 4) = uVar29;
        } while( true );
      }
      if (uVar22 == 2) {
        uVar41 = 0;
        uVar29 = 0;
        if (cVar3 == '\0') {
LAB_00188855:
          uVar29 = (uint)uVar41;
          local_d8 = (ulong)(int)uVar29;
          if (*(char *)(lVar1 + local_d8) == '\0') {
            uVar41 = uVar41 & 0xffffffff;
LAB_00188871:
            uVar29 = (uint)uVar41;
            if (*(char *)(lVar24 + 1 + (long)(int)uVar29) != '\0') goto LAB_0018849e;
LAB_00188885:
            local_d8 = (ulong)(int)uVar29;
            if (*(char *)(lVar1 + 1 + local_d8) == '\0') goto LAB_0018a0cc;
          }
          else if (*(char *)(lVar24 + 1 + local_d8) != '\0') goto LAB_0018849e;
LAB_0018b27b:
          uVar41 = (ulong)TTA::length_;
          TTA::rtable_[uVar41] = TTA::length_;
          TTA::next_[uVar41] = 0xffffffff;
          TTA::tail_[TTA::length_] = TTA::length_;
          uVar29 = TTA::length_ + 1;
          *(uint *)(lVar19 + local_d8 * 4) = TTA::length_;
          TTA::length_ = uVar29;
        }
        else {
LAB_0018849e:
          local_d8 = (ulong)(int)uVar29;
          uVar47 = (ulong)uVar29;
          if (*(char *)(lVar32 + 1 + local_d8) == '\0') goto LAB_00188511;
LAB_0018851e:
          uVar17 = *(undefined4 *)(lVar43 + local_d8 * 4);
LAB_0018b274:
          *(undefined4 *)(lVar19 + local_d8 * 4) = uVar17;
        }
      }
      else {
        uVar41 = 0;
        uVar47 = 0;
        if (cVar3 != '\0') {
LAB_00188511:
          local_d8 = (ulong)(int)uVar47;
          cVar3 = *(char *)(lVar32 + local_d8);
joined_r0x0018a15f:
          if (cVar3 == '\0') goto LAB_0018b27b;
          goto LAB_0018851e;
        }
LAB_001887f7:
        local_d8 = (ulong)(int)uVar41;
        if (*(char *)(lVar1 + local_d8) != '\0') goto LAB_0018b27b;
LAB_0018a0cc:
        *(undefined4 *)(lVar19 + local_d8 * 4) = 0;
      }
LAB_0018b2bb:
      lVar37 = lVar37 + 2;
      lVar34 = lVar34 + 2;
      lVar49 = lVar49 + 2;
      lVar30 = lVar30 + 2;
    } while ((int)lVar37 < *(int *)&(this->super_Labeling2D<(Connectivity2D)8,_false>).field_0x74);
    if ((this->o_rows & 1U) == 0) {
      return;
    }
  }
  pMVar4 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
  pMVar5 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_;
  lVar34 = *(long *)&pMVar4->field_0x10;
  lVar49 = **(long **)&pMVar4->field_0x48;
  lVar19 = (long)(int)(uVar12 - 1);
  lVar30 = lVar34 + lVar49 * lVar19;
  lVar45 = lVar30 - lVar49;
  lVar24 = *(long *)&pMVar5->field_0x10;
  lVar1 = **(long **)&pMVar5->field_0x48;
  lVar37 = lVar24 + lVar1 * lVar19;
  lVar25 = lVar37 + lVar1 * -2;
  uVar12 = 0;
  if (2 < (int)uVar22) {
    lVar50 = lVar45 - lVar49;
    lVar2 = lVar45 + 1;
    lVar35 = lVar25 + 8;
    uVar16 = uVar16 & 0xffffffff;
    lVar36 = lVar1 * lVar19 + lVar24 + 8;
    lVar43 = (lVar19 + -1) * lVar49;
    lVar40 = lVar43 + lVar34 + 4;
    lVar32 = lVar49 * lVar19 + lVar34 + 3;
    lVar13 = lVar49 * (lVar19 + -2) + lVar34 + 3;
    lVar49 = lVar1 * (lVar19 + -2) + lVar24 + 0x10;
    iVar31 = -2;
    uVar41 = 0;
    do {
      lVar24 = (long)(int)uVar41;
      if (*(char *)(lVar30 + lVar24) == '\0') goto LAB_0018bab6;
      if (*(char *)((long)iVar31 + 3 + lVar45) != '\0') {
        *(undefined4 *)(lVar37 + lVar24 * 4) = *(undefined4 *)(lVar25 + lVar24 * 4);
        goto LAB_0018c2e8;
      }
      if (*(char *)(lVar30 + 3 + (long)iVar31) != '\0') {
LAB_0018bad0:
        uVar47 = (ulong)(int)uVar41;
        if (*(char *)(lVar45 + 2 + uVar47) != '\0') {
          if (*(char *)(lVar45 + uVar47) != '\0') goto LAB_0018bae7;
          goto LAB_0018be59;
        }
        if (*(char *)(lVar45 + uVar47) == '\0') goto LAB_0018be64;
LAB_0018bb07:
        *(undefined4 *)(lVar37 + uVar47 * 4) = *(undefined4 *)(lVar25 + uVar47 * 4);
        lVar24 = (long)(int)uVar41;
        uVar47 = lVar24 + 2;
        if ((int)uVar47 < local_b0) {
          uVar41 = uVar47;
          if (*(char *)(lVar30 + uVar47) == '\0') goto LAB_0018be0c;
          if (*(char *)(lVar24 + 3 + lVar45) != '\0') {
            if (*(char *)(lVar50 + uVar47) == '\0') {
              uVar12 = TTA::Merge(*(uint *)(lVar25 + 8 + lVar24 * 4),*(uint *)(lVar37 + lVar24 * 4))
              ;
              *(uint *)(lVar37 + 8 + lVar24 * 4) = uVar12;
              goto LAB_0018c2e8;
            }
LAB_0018c197:
            if (*(char *)(lVar50 + -1 + uVar47) != '\0') goto LAB_0018c43b;
            uVar12 = *(uint *)(lVar25 + -8 + uVar47 * 4);
            uVar22 = *(uint *)(lVar25 + uVar47 * 4);
            goto LAB_0018c490;
          }
          if (*(char *)(lVar30 + 3 + lVar24) != '\0') {
            if (*(char *)(lVar24 + 4 + lVar45) == '\0') goto LAB_0018bde8;
            if ((*(char *)(lVar50 + 3 + lVar24) == '\0') || (*(char *)(lVar50 + uVar47) == '\0')) {
              uVar12 = TTA::Merge(*(uint *)(lVar25 + 0x10 + lVar24 * 4),
                                  *(uint *)(lVar37 + lVar24 * 4));
              *(uint *)(lVar37 + 8 + lVar24 * 4) = uVar12;
              goto LAB_0018bea4;
            }
LAB_0018c22c:
            cVar3 = *(char *)(lVar50 + -1 + uVar47);
            uVar12 = *(uint *)(lVar35 + uVar47 * 4);
joined_r0x0018c240:
            if (cVar3 != '\0') {
              *(uint *)(lVar37 + uVar47 * 4) = uVar12;
              uVar47 = uVar41;
              goto LAB_0018bea4;
            }
LAB_0018c4db:
            uVar22 = *(uint *)(lVar37 + -8 + uVar47 * 4);
            do {
              uVar12 = TTA::Merge(uVar12,uVar22);
LAB_0018c4f3:
              *(uint *)(lVar37 + uVar47 * 4) = uVar12;
              uVar47 = uVar41;
LAB_0018bea4:
              iVar31 = (int)uVar47;
              uVar12 = iVar31 + 2;
              if (local_b0 <= (int)uVar12) {
LAB_0018c672:
                if (local_b0 < (int)uVar12) {
                  uVar47 = (ulong)uVar12;
                  goto LAB_0018c67b;
                }
                uVar47 = (ulong)(int)uVar12;
                lVar34 = (long)iVar31;
                if (*(char *)(lVar30 + uVar47) == '\0') {
                  if (*(char *)(lVar30 + 3 + lVar34) == '\0') goto LAB_0018c858;
                  goto LAB_0018c8d0;
                }
                if (*(char *)(lVar45 + 3 + lVar34) != '\0') goto LAB_0018c8d0;
LAB_0018c6ab:
                uVar17 = *(undefined4 *)(lVar37 + lVar34 * 4);
                goto LAB_0018c8d5;
              }
              lVar48 = (long)iVar31;
              lVar20 = lVar48 << 0x20;
              lVar24 = lVar36 + lVar48 * 4;
              lVar1 = lVar40 + lVar48;
              lVar19 = lVar49 + lVar48 * 4;
              lVar46 = 0;
LAB_0018bf10:
              if (*(char *)(lVar32 + lVar48 + -1 + lVar46) != '\0') {
                iVar42 = (int)lVar46;
                iVar21 = (int)(lVar48 + 2);
                if (*(char *)(lVar1 + -1 + lVar46) != '\0') {
                  uVar41 = (ulong)(uint)(iVar21 + iVar42);
                  *(undefined4 *)(lVar24 + lVar46 * 4) = *(undefined4 *)(lVar19 + -8 + lVar46 * 4);
                  goto LAB_0018c2e8;
                }
                if (*(char *)(lVar32 + lVar48 + lVar46) != '\0') goto code_r0x0018bf33;
                uVar12 = iVar21 + iVar42;
                *(undefined4 *)(lVar24 + lVar46 * 4) = *(undefined4 *)(lVar37 + (lVar20 >> 0x1e));
LAB_0018c1ca:
                uVar41 = (ulong)uVar12;
                goto LAB_0018c54c;
              }
              uVar41 = lVar48 + 2 + lVar46;
              iVar31 = (int)uVar41;
              lVar24 = lVar20 + 0x300000000 >> 0x20;
              uVar47 = lVar48 + 2 + lVar46;
              if (*(char *)(lVar30 + lVar24) == '\0') goto LAB_0018bbe6;
              if (*(char *)(lVar45 + lVar24) != '\0') {
LAB_0018be22:
                do {
                  *(undefined4 *)(lVar37 + uVar47 * 4) = *(undefined4 *)(lVar25 + uVar47 * 4);
                  uVar47 = (long)(int)uVar41 + 2;
                  if (local_b0 <= (int)uVar47) {
                    if (local_b0 < (int)uVar47) goto LAB_0018c67b;
                    if (*(char *)(lVar30 + uVar47) == '\0') goto LAB_0018c708;
LAB_0018c6c9:
                    if (*(char *)(lVar45 + 1 + uVar47) == '\0') {
                      uVar17 = *(undefined4 *)(lVar37 + -8 + uVar47 * 4);
                      goto LAB_0018c724;
                    }
                    if (*(char *)(lVar45 + uVar47) != '\0') goto LAB_0018c71f;
                    uVar12 = *(uint *)(lVar25 + uVar47 * 4);
                    if (*(char *)(lVar50 + uVar47) != '\0') {
                      *(uint *)(lVar37 + uVar47 * 4) = uVar12;
                      return;
                    }
                    uVar22 = *(uint *)(lVar37 + -8 + uVar47 * 4);
                    goto LAB_0018c963;
                  }
                  uVar41 = uVar47;
                  if (*(char *)(lVar30 + uVar47) != '\0') goto LAB_0018c39a;
LAB_0018bab6:
                  iVar31 = (int)uVar41;
                  uVar47 = (ulong)iVar31;
                  if (*(char *)(uVar47 + 1 + lVar30) == '\0') {
                    while( true ) {
                      uVar47 = (ulong)iVar31;
LAB_0018bbe6:
                      *(undefined4 *)(lVar37 + uVar47 * 4) = 0;
                      lVar24 = (long)iVar31;
                      uVar47 = lVar24 + 2;
                      if (local_b0 <= (int)uVar47) break;
                      uVar41 = uVar47;
                      if (*(char *)(lVar30 + uVar47) == '\0') goto LAB_0018bab6;
                      if (*(char *)(lVar24 + 3 + lVar45) != '\0') {
                        if ((*(char *)(lVar45 + uVar47) == '\0') &&
                           (*(char *)(lVar2 + lVar24) != '\0')) goto LAB_0018c434;
                        *(undefined4 *)(lVar37 + 8 + lVar24 * 4) =
                             *(undefined4 *)(lVar25 + 8 + lVar24 * 4);
                        goto LAB_0018c2e8;
                      }
                      if (*(char *)(lVar30 + 3 + lVar24) == '\0') {
                        if (*(char *)(lVar45 + uVar47) == '\0') {
                          if (*(char *)(lVar2 + lVar24) == '\0') {
                            uVar41 = (ulong)TTA::length_;
                            TTA::rtable_[uVar41] = TTA::length_;
                            TTA::next_[uVar41] = 0xffffffff;
                            TTA::tail_[TTA::length_] = TTA::length_;
                            uVar12 = TTA::length_ + 1;
                            *(uint *)(lVar37 + 8 + lVar24 * 4) = TTA::length_;
                            TTA::length_ = uVar12;
                            uVar41 = uVar47;
                            goto LAB_0018c54c;
                          }
                          uVar17 = *(undefined4 *)(lVar25 + lVar24 * 4);
                        }
                        else {
                          uVar17 = *(undefined4 *)(lVar25 + 8 + lVar24 * 4);
                        }
                        *(undefined4 *)(lVar37 + 8 + lVar24 * 4) = uVar17;
                        goto LAB_0018c54c;
                      }
                      cVar3 = *(char *)(lVar24 + 2 + lVar45);
                      if (*(char *)(lVar24 + 4 + lVar45) != '\0') {
                        if (cVar3 != '\0') goto LAB_0018bae7;
                        if (*(char *)(lVar2 + lVar24) == '\0') {
                          *(undefined4 *)(lVar37 + 8 + lVar24 * 4) =
                               *(undefined4 *)(lVar25 + 0x10 + lVar24 * 4);
                        }
                        else {
LAB_0018c503:
                          if ((*(char *)(lVar50 + 1 + uVar47) == '\0') ||
                             (*(char *)(lVar50 + uVar47) == '\0')) {
                            uVar12 = TTA::Merge(*(uint *)(lVar25 + -8 + uVar47 * 4),
                                                *(uint *)(lVar25 + 8 + uVar47 * 4));
                          }
                          else {
                            uVar12 = *(uint *)(lVar35 + uVar47 * 4);
                          }
                          *(uint *)(lVar37 + uVar47 * 4) = uVar12;
                          uVar47 = uVar41;
                        }
                        goto LAB_0018bea4;
                      }
                      if (cVar3 != '\0') goto LAB_0018bb07;
                      if (*(char *)(lVar2 + lVar24) == '\0') {
                        uVar15 = (ulong)TTA::length_;
                        TTA::rtable_[uVar15] = TTA::length_;
                        TTA::next_[uVar15] = 0xffffffff;
                        TTA::tail_[TTA::length_] = TTA::length_;
                        uVar12 = TTA::length_;
                        TTA::length_ = TTA::length_ + 1;
                      }
                      else {
                        uVar12 = *(uint *)(lVar25 + lVar24 * 4);
                      }
LAB_0018bd53:
                      *(uint *)(lVar37 + uVar47 * 4) = uVar12;
                      lVar24 = (long)(int)uVar41;
                      uVar47 = lVar24 + 2;
                      if (local_b0 <= (int)uVar47) {
                        if (local_b0 < (int)uVar47) goto LAB_0018c67b;
                        uVar16 = uVar47;
                        if (*(char *)(lVar30 + uVar47) == '\0') goto LAB_0018c7fe;
                        if (*(char *)(lVar45 + 3 + lVar24) == '\0') goto LAB_0018c941;
                        goto LAB_0018c7eb;
                      }
                      uVar41 = uVar47;
                      if (*(char *)(lVar30 + uVar47) != '\0') {
                        if (*(char *)(lVar24 + 3 + lVar45) != '\0') {
                          uVar12 = TTA::Merge(*(uint *)(lVar25 + 8 + lVar24 * 4),
                                              *(uint *)(lVar37 + lVar24 * 4));
                          *(uint *)(lVar37 + 8 + lVar24 * 4) = uVar12;
                          goto LAB_0018c2e8;
                        }
                        if (*(char *)(lVar30 + 3 + lVar24) == '\0') {
                          *(undefined4 *)(lVar37 + 8 + lVar24 * 4) =
                               *(undefined4 *)(lVar37 + lVar24 * 4);
                          goto LAB_0018c54c;
                        }
                        if (*(char *)(lVar24 + 4 + lVar45) != '\0') {
                          uVar12 = TTA::Merge(*(uint *)(lVar25 + 0x10 + lVar24 * 4),
                                              *(uint *)(lVar37 + lVar24 * 4));
                          *(uint *)(lVar37 + 8 + lVar24 * 4) = uVar12;
                          goto LAB_0018bea4;
                        }
LAB_0018bde8:
                        *(undefined4 *)(lVar37 + 8 + lVar24 * 4) =
                             *(undefined4 *)(lVar37 + lVar24 * 4);
LAB_0018c09b:
                        while( true ) {
                          iVar31 = (int)uVar41;
                          uVar12 = iVar31 + 2;
                          if (local_b0 <= (int)uVar12) break;
                          lVar46 = (long)iVar31;
                          lVar24 = lVar46 + 2;
                          lVar48 = lVar46 << 0x20;
                          lVar1 = lVar36 + lVar46 * 4;
                          lVar19 = lVar40 + lVar46;
                          lVar20 = 0;
                          while( true ) {
                            if (*(char *)(lVar32 + lVar46 + -1 + lVar20) == '\0') {
                              uVar41 = (ulong)(uint)((int)lVar24 + (int)lVar20);
                              goto LAB_0018be0c;
                            }
                            lVar14 = lVar48 >> 0x1e;
                            lVar23 = lVar48 >> 0x20;
                            if (*(char *)(lVar19 + -1 + lVar20) != '\0') break;
                            if (*(char *)(lVar32 + lVar46 + lVar20) == '\0') {
                              uVar12 = (int)lVar24 + (int)lVar20;
                              *(undefined4 *)(lVar1 + lVar20 * 4) = *(undefined4 *)(lVar37 + lVar14)
                              ;
                              goto LAB_0018c1ca;
                            }
                            if (*(char *)(lVar19 + lVar20) != '\0') {
                              if ((*(char *)(lVar20 + lVar13 + lVar46) == '\0') ||
                                 (*(char *)(lVar20 + -1 + lVar13 + lVar46) == '\0')) {
                                uVar12 = *(uint *)(lVar49 + lVar46 * 4 + lVar20 * 4);
                                uVar22 = *(uint *)(lVar37 + lVar14);
                              }
                              else {
                                if (*(char *)(lVar45 + lVar23) != '\0') {
                                  uVar47 = lVar48 + 0x200000000 >> 0x20;
                                  uVar41 = lVar24 + lVar20 & 0xffffffff;
                                  goto LAB_0018c22c;
                                }
                                uVar12 = *(uint *)(lVar49 + lVar46 * 4 + lVar20 * 4);
                                uVar22 = *(uint *)(lVar37 + lVar23 * 4);
                              }
                              uVar12 = TTA::Merge(uVar12,uVar22);
                              *(uint *)(lVar1 + lVar20 * 4) = uVar12;
                              uVar47 = lVar24 + lVar20 & 0xffffffff;
                              goto LAB_0018bea4;
                            }
                            *(undefined4 *)(lVar1 + lVar20 * 4) =
                                 *(undefined4 *)(lVar1 + -8 + lVar20 * 4);
                            lVar48 = lVar48 + 0x200000000;
                            lVar23 = lVar20 + lVar24;
                            lVar20 = lVar20 + 2;
                            if ((long)uVar16 <= lVar23 + 2) {
                              uVar12 = iVar31 + (int)lVar20 + 2;
                              iVar31 = iVar31 + (int)lVar20;
                              goto LAB_0018c5bb;
                            }
                          }
                          if (*(char *)(lVar20 + -1 + lVar13 + lVar46) == '\0') {
                            uVar12 = *(uint *)(lVar49 + lVar46 * 4 + -8 + lVar20 * 4);
                            uVar22 = *(uint *)(lVar37 + lVar14);
                          }
                          else {
                            if (*(char *)(lVar45 + lVar23) != '\0') {
                              uVar47 = lVar48 + 0x200000000 >> 0x20;
                              uVar41 = lVar24 + lVar20 & 0xffffffff;
                              goto LAB_0018c197;
                            }
                            uVar12 = *(uint *)(lVar49 + lVar46 * 4 + -8 + lVar20 * 4);
                            uVar22 = *(uint *)(lVar37 + lVar23 * 4);
                          }
                          uVar12 = TTA::Merge(uVar12,uVar22);
                          *(uint *)(lVar1 + lVar20 * 4) = uVar12;
                          uVar41 = lVar24 + lVar20 & 0xffffffff;
LAB_0018c2e8:
                          iVar31 = (int)uVar41;
                          iVar21 = iVar31 + 2;
                          if (local_b0 <= iVar21) {
LAB_0018c62a:
                            uVar47 = (ulong)iVar21;
                            if (local_b0 < iVar21) {
                              if (*(char *)(lVar30 + uVar47) == '\0') goto LAB_0018c858;
                              lVar34 = (long)iVar31;
                              if (*(char *)(lVar30 + 1 + lVar34) != '\0') goto LAB_0018c6ab;
                            }
                            else {
                              if (*(char *)(lVar30 + uVar47) == '\0') goto LAB_0018c708;
                              if (*(char *)(lVar30 + 1 + (long)iVar31) != '\0') goto LAB_0018c6c9;
                              if (*(char *)(lVar45 + 3 + (long)iVar31) != '\0') {
                                if (*(char *)(lVar45 + uVar47) == '\0') goto LAB_0018c8af;
                                goto LAB_0018c8d0;
                              }
                            }
                            if (*(char *)(lVar45 + uVar47) != '\0') goto LAB_0018c8d0;
                            uVar17 = *(undefined4 *)(lVar25 + (long)iVar31 * 4);
                            goto LAB_0018c8d5;
                          }
                          lVar23 = (long)iVar31;
                          lVar24 = lVar23 + 2;
                          lVar1 = lVar49 + lVar23 * 4;
                          lVar19 = lVar34 + lVar43 + 2 + lVar23;
                          lVar46 = lVar32 + lVar23;
                          lVar48 = lVar36 + lVar23 * 4;
                          lVar23 = lVar23 << 0x20;
                          lVar20 = 0;
LAB_0018c33b:
                          lVar23 = lVar23 + 0x200000000;
                          iVar21 = (int)lVar24;
                          iVar42 = (int)lVar20;
                          if (*(char *)(lVar46 + -1 + lVar20) == '\0') {
                            uVar41 = (ulong)(uint)(iVar21 + iVar42);
                            goto LAB_0018bab6;
                          }
                          if (*(char *)(lVar46 + -2 + lVar20) == '\0') {
                            if (*(char *)(lVar19 + 1 + lVar20) == '\0') {
                              uVar47 = lVar24 + lVar20;
                              if (*(char *)(lVar20 + lVar46) == '\0') {
                                if (*(char *)(lVar20 + lVar19) == '\0') {
                                  uVar17 = *(undefined4 *)(lVar1 + -0x10 + lVar20 * 4);
                                }
                                else {
                                  uVar17 = *(undefined4 *)(lVar1 + -8 + lVar20 * 4);
                                }
                                *(undefined4 *)(lVar48 + lVar20 * 4) = uVar17;
                                uVar41 = uVar47 & 0xffffffff;
                                goto LAB_0018c54c;
                              }
                              if (*(char *)(lVar20 + 2 + lVar19) == '\0') {
                                if (*(char *)(lVar20 + lVar19) == '\0') {
                                  uVar41 = uVar47 & 0xffffffff;
                                  uVar12 = *(uint *)(lVar1 + -0x10 + lVar20 * 4);
                                  goto LAB_0018bd53;
                                }
                                uVar41 = uVar47 & 0xffffffff;
                                goto LAB_0018bb07;
                              }
                              if (*(char *)(lVar20 + lVar19) != '\0') {
                                uVar41 = uVar47 & 0xffffffff;
                                goto LAB_0018bae7;
                              }
                              uVar41 = uVar47 & 0xffffffff;
                              uVar47 = lVar23 >> 0x20;
                              goto LAB_0018c503;
                            }
                            if (*(char *)(lVar19 + lVar20) != '\0') goto code_r0x0018c360;
                            uVar47 = lVar23 >> 0x20;
                            uVar41 = (ulong)(uint)(iVar21 + iVar42);
LAB_0018c434:
                            if (*(char *)(lVar50 + uVar47) == '\0') {
                              uVar12 = TTA::Merge(*(uint *)(lVar25 + -8 + uVar47 * 4),
                                                  *(uint *)(lVar25 + uVar47 * 4));
                            }
                            else {
LAB_0018c43b:
                              uVar12 = *(uint *)(lVar25 + uVar47 * 4);
                            }
LAB_0018c4ae:
                            *(uint *)(lVar37 + uVar47 * 4) = uVar12;
                            goto LAB_0018c2e8;
                          }
                          uVar41 = (ulong)(uint)(iVar21 + iVar42);
LAB_0018c39a:
                          uVar47 = (ulong)(int)uVar41;
                          if (*(char *)(uVar47 + 1 + lVar45) != '\0') {
                            if (*(char *)(lVar45 + uVar47) != '\0') goto LAB_0018c43b;
                            uVar12 = *(uint *)(lVar25 + uVar47 * 4);
                            if (*(char *)(lVar50 + uVar47) == '\0') {
                              uVar22 = *(uint *)(lVar37 + -8 + uVar47 * 4);
LAB_0018c490:
                              uVar12 = TTA::Merge(uVar12,uVar22);
                              goto LAB_0018c4ae;
                            }
                            *(uint *)(lVar37 + uVar47 * 4) = uVar12;
                            goto LAB_0018c2e8;
                          }
                          if (*(char *)(lVar30 + 1 + uVar47) == '\0') {
                            *(undefined4 *)(lVar37 + uVar47 * 4) =
                                 *(undefined4 *)(lVar37 + -8 + uVar47 * 4);
                            goto LAB_0018c54c;
                          }
                          if (*(char *)(uVar47 + 2 + lVar45) != '\0') {
                            if (*(char *)(lVar50 + 1 + uVar47) == '\0') {
                              uVar12 = *(uint *)(lVar25 + 8 + uVar47 * 4);
                              goto LAB_0018c4db;
                            }
                            if (*(char *)(lVar45 + uVar47) != '\0') {
                              uVar12 = *(uint *)(lVar25 + 8 + uVar47 * 4);
                              goto LAB_0018c4f3;
                            }
                            cVar3 = *(char *)(lVar50 + uVar47);
                            uVar12 = *(uint *)(lVar25 + 8 + uVar47 * 4);
                            goto joined_r0x0018c240;
                          }
                          *(undefined4 *)(lVar37 + uVar47 * 4) =
                               *(undefined4 *)(lVar37 + -8 + uVar47 * 4);
                        }
LAB_0018c5bb:
                        uVar47 = (ulong)uVar12;
                        if (local_b0 < (int)uVar12) goto LAB_0018c67b;
                        uVar47 = (ulong)(int)uVar12;
                        uVar16 = (ulong)uVar12;
                        if (*(char *)(lVar30 + uVar47) == '\0') goto LAB_0018c7fe;
                        lVar30 = (long)iVar31;
                        if (*(char *)(lVar45 + 3 + lVar30) == '\0') {
                          uVar12 = *(uint *)(lVar37 + lVar30 * 4);
                          goto LAB_0018c968;
                        }
                        if ((*(char *)(lVar50 + uVar47) != '\0') &&
                           (*(char *)(lVar45 + lVar30) != '\0')) goto LAB_0018c60a;
                        uVar12 = *(uint *)(lVar25 + uVar47 * 4);
                        uVar22 = *(uint *)(lVar37 + lVar30 * 4);
                        goto LAB_0018c963;
                      }
LAB_0018be0c:
                      iVar31 = (int)uVar41;
                      uVar47 = (ulong)iVar31;
                      if (*(char *)(uVar47 + 1 + lVar30) != '\0') {
                        if (*(char *)(lVar45 + 1 + uVar47) != '\0') goto LAB_0018be22;
                        uVar47 = (ulong)iVar31;
                        if (*(char *)(uVar47 + 2 + lVar45) != '\0') goto LAB_0018be59;
LAB_0018be64:
                        uVar15 = (ulong)TTA::length_;
                        TTA::rtable_[uVar15] = TTA::length_;
                        TTA::next_[uVar15] = 0xffffffff;
                        TTA::tail_[TTA::length_] = TTA::length_;
                        uVar12 = TTA::length_;
                        TTA::length_ = TTA::length_ + 1;
                        goto LAB_0018bd53;
                      }
                    }
                    if (local_b0 < (int)uVar47) {
                      if (*(char *)(lVar30 + uVar47) == '\0') {
                        *(undefined4 *)(lVar37 + 8 + lVar24 * 4) = 0;
                        return;
                      }
LAB_0018c924:
                      if (*(char *)(lVar45 + uVar47) == '\0') {
                        if (*(char *)(lVar45 + 1 + lVar24) == '\0') {
                          uVar16 = (ulong)TTA::length_;
                          TTA::rtable_[uVar16] = TTA::length_;
                          TTA::next_[uVar16] = 0xffffffff;
                          TTA::tail_[TTA::length_] = TTA::length_;
                          uVar12 = TTA::length_ + 1;
                          *(uint *)(lVar37 + 8 + lVar24 * 4) = TTA::length_;
                          TTA::length_ = uVar12;
                          return;
                        }
                        uVar17 = *(undefined4 *)(lVar25 + lVar24 * 4);
                        goto LAB_0018c930;
                      }
                    }
                    else {
                      if (*(char *)(lVar30 + uVar47) == '\0') goto LAB_0018c708;
                      if (*(char *)(lVar45 + 3 + lVar24) == '\0') goto LAB_0018c924;
                      if ((*(char *)(lVar45 + uVar47) == '\0') &&
                         (*(char *)(lVar45 + 1 + lVar24) != '\0')) {
LAB_0018c8af:
                        cVar3 = *(char *)(lVar50 + uVar47);
                        goto joined_r0x0018c8b4;
                      }
                    }
                    uVar17 = *(undefined4 *)(lVar25 + 8 + lVar24 * 4);
LAB_0018c930:
                    *(undefined4 *)(lVar37 + 8 + lVar24 * 4) = uVar17;
                    return;
                  }
                } while (*(char *)(lVar45 + 1 + uVar47) != '\0');
                goto LAB_0018bad0;
              }
              if (*(char *)(lVar45 + 4 + (lVar20 >> 0x20)) == '\0') goto LAB_0018bb07;
LAB_0018bae7:
              uVar47 = (ulong)(int)uVar41;
              if (*(char *)(lVar50 + 1 + uVar47) != '\0') {
                uVar12 = *(uint *)(lVar35 + uVar47 * 4);
                goto LAB_0018c4f3;
              }
              uVar12 = *(uint *)(lVar25 + uVar47 * 4);
              uVar22 = *(uint *)(lVar25 + 8 + uVar47 * 4);
            } while( true );
          }
          *(undefined4 *)(lVar37 + 8 + lVar24 * 4) = *(undefined4 *)(lVar37 + lVar24 * 4);
          goto LAB_0018c54c;
        }
        if (local_b0 < (int)uVar47) {
LAB_0018c67b:
          uVar47 = (ulong)(int)uVar47;
          if (*(char *)(lVar30 + uVar47) == '\0') {
LAB_0018c858:
            *(undefined4 *)(lVar37 + uVar47 * 4) = 0;
            return;
          }
          uVar17 = *(undefined4 *)(lVar37 + -8 + uVar47 * 4);
        }
        else {
          uVar16 = uVar47;
          if (*(char *)(lVar30 + uVar47) != '\0') {
            if (*(char *)(lVar45 + 3 + lVar24) == '\0') {
LAB_0018c941:
              uVar12 = *(uint *)(lVar37 + lVar24 * 4);
            }
            else {
              if (*(char *)(lVar50 + uVar47) != '\0') {
LAB_0018c60a:
                cVar3 = *(char *)(lVar50 + -1 + uVar47);
joined_r0x0018c8b4:
                if (cVar3 == '\0') {
                  uVar12 = *(uint *)(lVar25 + -8 + uVar47 * 4);
                  uVar22 = *(uint *)(lVar25 + uVar47 * 4);
LAB_0018c963:
                  uVar12 = TTA::Merge(uVar12,uVar22);
LAB_0018c968:
                  *(uint *)(lVar37 + uVar47 * 4) = uVar12;
                  return;
                }
                goto LAB_0018c71f;
              }
LAB_0018c7eb:
              uVar12 = TTA::Merge(*(uint *)(lVar25 + 8 + lVar24 * 4),*(uint *)(lVar37 + lVar24 * 4))
              ;
            }
            *(uint *)(lVar37 + 8 + lVar24 * 4) = uVar12;
            return;
          }
LAB_0018c7fe:
          uVar47 = (ulong)(int)uVar16;
          if (*(char *)(uVar47 + 1 + lVar30) == '\0') goto LAB_0018c858;
          if (*(char *)(lVar45 + 1 + uVar47) == '\0') {
            uVar16 = (ulong)TTA::length_;
            TTA::rtable_[uVar16] = TTA::length_;
            TTA::next_[uVar16] = 0xffffffff;
            TTA::tail_[TTA::length_] = TTA::length_;
            uVar12 = TTA::length_ + 1;
            *(uint *)(lVar37 + uVar47 * 4) = TTA::length_;
            TTA::length_ = uVar12;
            return;
          }
LAB_0018c8d0:
          uVar17 = *(undefined4 *)(lVar25 + uVar47 * 4);
        }
LAB_0018c8d5:
        *(undefined4 *)(lVar37 + uVar47 * 4) = uVar17;
        return;
      }
      if (*(char *)(lVar45 + lVar24) == '\0') {
        uVar47 = (ulong)TTA::length_;
        TTA::rtable_[uVar47] = TTA::length_;
        TTA::next_[uVar47] = 0xffffffff;
        TTA::tail_[TTA::length_] = TTA::length_;
        uVar12 = TTA::length_ + 1;
        *(uint *)(lVar37 + lVar24 * 4) = TTA::length_;
        TTA::length_ = uVar12;
      }
      else {
        *(undefined4 *)(lVar37 + lVar24 * 4) = *(undefined4 *)(lVar25 + lVar24 * 4);
      }
LAB_0018c54c:
      iVar31 = (int)uVar41;
      uVar12 = iVar31 + 2;
      uVar41 = (ulong)uVar12;
    } while ((int)uVar12 < local_b0);
  }
  uVar47 = (ulong)(int)uVar12;
  if (local_b0 < (int)uVar12) {
    if (*(char *)(lVar30 + uVar47) == '\0') {
LAB_0018c72d:
      *(undefined4 *)(lVar37 + uVar47 * 4) = 0;
      return;
    }
  }
  else {
    if (*(char *)(lVar30 + uVar47) == '\0') {
LAB_0018c708:
      if (*(char *)(lVar30 + 1 + uVar47) == '\0') goto LAB_0018c72d;
    }
    if (*(char *)(lVar45 + 1 + uVar47) != '\0') goto LAB_0018c71f;
  }
  if (*(char *)(lVar45 + uVar47) == '\0') {
    uVar16 = (ulong)TTA::length_;
    TTA::rtable_[uVar16] = TTA::length_;
    TTA::next_[uVar16] = 0xffffffff;
    TTA::tail_[TTA::length_] = TTA::length_;
    uVar12 = TTA::length_ + 1;
    *(uint *)(lVar37 + uVar47 * 4) = TTA::length_;
    TTA::length_ = uVar12;
    return;
  }
LAB_0018c71f:
  uVar17 = *(undefined4 *)(lVar25 + uVar47 * 4);
LAB_0018c724:
  *(undefined4 *)(lVar37 + uVar47 * 4) = uVar17;
  return;
LAB_00187e6c:
  uVar17 = 0;
LAB_00187e7e:
  *(undefined4 *)(lVar37 + lVar34 * 4) = uVar17;
LAB_00187e82:
  uVar12 = uVar22 + 2;
  uVar16 = (ulong)uVar12;
  if ((int)uVar29 <= (int)uVar12) goto LAB_00187e91;
  goto LAB_00187db6;
code_r0x001880c9:
  uVar41 = lVar1 + lVar35 & 0xffffffff;
  goto LAB_00187fde;
LAB_0018b2e2:
  local_d8 = lVar50 + lVar14;
  if (*(char *)(lVar14 + 2 + lVar38 + lVar45) == '\0') goto LAB_001885dc;
  lVar20 = lVar27 + 0x300000000 >> 0x20;
  lVar23 = lVar27 + 0x100000000 >> 0x20;
  if (*(char *)(lVar24 + lVar20) == '\0') {
    if (*(char *)(lVar1 + lVar23) != '\0') {
      *(undefined4 *)(lVar48 + lVar35 + 8 + lVar14 * 4) = *(undefined4 *)(lVar19 + lVar28);
      goto LAB_001890a6;
    }
    if (*(char *)(lVar24 + lVar23) != '\0') {
      *(undefined4 *)(lVar48 + lVar35 + 8 + lVar14 * 4) = *(undefined4 *)(lVar19 + lVar28);
      goto LAB_001890a6;
    }
    uVar41 = (ulong)TTA::length_;
    TTA::rtable_[uVar41] = TTA::length_;
    TTA::next_[uVar41] = 0xffffffff;
    TTA::tail_[TTA::length_] = TTA::length_;
    uVar29 = TTA::length_ + 1;
    *(uint *)(lVar48 + lVar35 + 8 + lVar14 * 4) = TTA::length_;
    TTA::length_ = uVar29;
    goto LAB_001890a6;
  }
  uVar41 = local_d8;
  if (*(char *)(lVar24 + lVar23) != '\0') {
    uVar47 = lVar27 + 0x200000000 >> 0x20;
    goto LAB_0018b36f;
  }
  if (*(char *)(lVar1 + lVar23) == '\0') goto LAB_001885ee;
  if (*(char *)(lVar32 + lVar20) != '\0') goto LAB_0018b37d;
  if (*(char *)(lVar32 + 4 + lVar44) != '\0') {
    uVar47 = lVar27 + 0x200000000 >> 0x20;
    goto LAB_0018a66c;
  }
  if (*(char *)(lVar14 + 2 + lVar33 + lVar45) == '\0') {
    *(undefined4 *)(lVar18 + lVar14 * 4) = *(undefined4 *)(lVar19 + lVar44 * 4);
LAB_0018b7ba:
    local_d8 = lVar50 + lVar14;
    goto LAB_00189841;
  }
  *(undefined4 *)(lVar18 + lVar14 * 4) = *(undefined4 *)(lVar46 + lVar35 + 8 + lVar14 * 4);
LAB_0018b5e9:
  local_d8 = lVar50 + lVar14;
LAB_00188d00:
  lVar50 = (long)(int)local_d8;
  local_d8 = lVar50 + 2;
  iVar31 = (int)local_d8;
  if (iVar31 < local_b0) {
    if (*(char *)(lVar24 + local_d8) == '\0') {
      if (*(char *)(lVar1 + local_d8) == '\0') goto LAB_0018997d;
      if (*(char *)(lVar50 + 3 + lVar24) == '\0') {
LAB_00189ac2:
        *(undefined4 *)(lVar19 + 8 + lVar50 * 4) = *(undefined4 *)(lVar19 + lVar50 * 4);
        local_d8 = local_d8 & 0xffffffff;
        goto LAB_001890a6;
      }
      if (*(char *)(lVar32 + 3 + lVar50) != '\0') {
        uVar41 = local_d8;
        if (*(char *)(lVar40 + local_d8) == '\0') {
          uVar29 = TTA::Merge(*(uint *)(lVar43 + 8 + lVar50 * 4),*(uint *)(lVar19 + lVar50 * 4));
          *(uint *)(lVar19 + 8 + lVar50 * 4) = uVar29;
          goto LAB_0018999c;
        }
LAB_0018a3c0:
        uVar29 = *(uint *)(lVar43 + uVar41 * 4);
        if (*(char *)(lVar40 + -1 + uVar41) != '\0') {
          *(uint *)(lVar19 + uVar41 * 4) = uVar29;
          goto LAB_0018999c;
        }
        uVar29 = TTA::Merge(uVar29,*(uint *)(lVar19 + -8 + uVar41 * 4));
        *(uint *)(lVar19 + uVar41 * 4) = uVar29;
        goto LAB_0018999c;
      }
    }
    else {
      if (*(char *)(lVar50 + 3 + lVar32) != '\0') {
        uVar41 = local_d8;
        if (*(char *)(lVar40 + local_d8) == '\0') {
          uVar29 = TTA::Merge(*(uint *)(lVar43 + 8 + lVar50 * 4),*(uint *)(lVar19 + lVar50 * 4));
          *(uint *)(lVar19 + 8 + lVar50 * 4) = uVar29;
        }
        else {
LAB_00188d38:
          uVar29 = *(uint *)(lVar43 + uVar41 * 4);
          if (*(char *)(lVar40 + -1 + uVar41) == '\0') {
            uVar29 = TTA::Merge(uVar29,*(uint *)(lVar19 + -8 + uVar41 * 4));
            *(uint *)(lVar19 + uVar41 * 4) = uVar29;
          }
          else {
            *(uint *)(lVar19 + uVar41 * 4) = uVar29;
          }
        }
        goto LAB_0018af8c;
      }
      if (*(char *)(lVar24 + 3 + lVar50) == '\0') {
        *(undefined4 *)(lVar19 + 8 + lVar50 * 4) = *(undefined4 *)(lVar19 + lVar50 * 4);
        goto LAB_0018a6cb;
      }
    }
    if (*(char *)(lVar50 + 4 + lVar32) != '\0') {
      if ((*(char *)(lVar40 + 3 + lVar50) != '\0') &&
         (uVar41 = local_d8, *(char *)(lVar40 + local_d8) != '\0')) goto LAB_0018a1c7;
      uVar29 = TTA::Merge(*(uint *)(lVar43 + 0x10 + lVar50 * 4),*(uint *)(lVar19 + lVar50 * 4));
      *(uint *)(lVar19 + 8 + lVar50 * 4) = uVar29;
      goto LAB_00189b81;
    }
    *(undefined4 *)(lVar19 + 8 + lVar50 * 4) = *(undefined4 *)(lVar19 + lVar50 * 4);
LAB_00189b77:
    local_d8 = local_d8 & 0xffffffff;
LAB_00189f8b:
    iVar21 = (int)local_d8;
    uVar29 = iVar21 + 2;
    if ((int)uVar29 < local_b0) {
      lVar20 = (long)iVar21;
      lVar50 = lVar20 + 2;
      lVar27 = lVar20 << 0x20;
      lVar46 = lVar13 + lVar20 * 4;
      lVar48 = lVar35 + 8 + lVar46;
      lVar23 = lVar36 + lVar20 + lVar45;
      lVar14 = lVar23 + 3;
      lVar26 = lVar25 * lVar34 + lVar20 + lVar45;
      lVar18 = 0;
      do {
        lVar38 = lVar27 >> 0x1e;
        iVar42 = (int)lVar18;
        iVar31 = (int)lVar50;
        lVar33 = lVar27 >> 0x20;
        if (*(char *)(lVar23 + 2 + lVar18) == '\0') {
          if (*(char *)(lVar25 * lVar30 + lVar20 + lVar45 + 2 + lVar18) == '\0') {
            local_d8 = (ulong)(uint)(iVar31 + iVar42);
            goto LAB_0018997d;
          }
          if (*(char *)(lVar14 + lVar18) == '\0') {
            uVar29 = iVar31 + iVar42;
            *(undefined4 *)(lVar46 + lVar35 + 8 + lVar18 * 4) = *(undefined4 *)(lVar19 + lVar38);
LAB_0018a35e:
            local_d8 = (ulong)uVar29;
            goto LAB_001890a6;
          }
          if (*(char *)(lVar26 + 3 + lVar18) != '\0') {
            local_d8 = lVar50 + lVar18;
            if (*(char *)(lVar18 + 2 + lVar25 * lVar49 + lVar20 + lVar45) == '\0') {
              uVar29 = TTA::Merge(*(uint *)(lVar2 * lVar49 + lVar20 * 4 + lVar35 + 8 + lVar18 * 4),
                                  *(uint *)(lVar19 + lVar38));
              *(uint *)(lVar48 + lVar18 * 4) = uVar29;
              goto LAB_0018999c;
            }
            if (*(char *)(lVar32 + lVar33) == '\0') {
              uVar29 = TTA::Merge(*(uint *)(lVar2 * lVar49 + lVar20 * 4 + lVar35 + 8 + lVar18 * 4),
                                  *(uint *)(lVar19 + lVar33 * 4));
              *(uint *)(lVar48 + lVar18 * 4) = uVar29;
              goto LAB_0018999c;
            }
            uVar41 = lVar27 + 0x200000000 >> 0x20;
            goto LAB_0018a3c0;
          }
        }
        else {
          if (*(char *)(lVar26 + 3 + lVar18) != '\0') {
            local_d8 = lVar50 + lVar18;
            if (*(char *)(lVar18 + 2 + lVar25 * lVar49 + lVar20 + lVar45) == '\0') {
              uVar29 = TTA::Merge(*(uint *)(lVar2 * lVar49 + lVar20 * 4 + lVar35 + 8 + lVar18 * 4),
                                  *(uint *)(lVar19 + lVar38));
              *(uint *)(lVar48 + lVar18 * 4) = uVar29;
              goto LAB_0018af8c;
            }
            if (*(char *)(lVar32 + lVar33) == '\0') {
              uVar29 = TTA::Merge(*(uint *)(lVar2 * lVar49 + lVar20 * 4 + lVar35 + 8 + lVar18 * 4),
                                  *(uint *)(lVar19 + lVar33 * 4));
              *(uint *)(lVar48 + lVar18 * 4) = uVar29;
              goto LAB_0018af8c;
            }
            uVar41 = lVar27 + 0x200000000 >> 0x20;
            goto LAB_00188d38;
          }
          if (*(char *)(lVar14 + lVar18) == '\0') {
            iVar31 = iVar31 + iVar42;
            *(undefined4 *)(lVar46 + lVar35 + 8 + lVar18 * 4) = *(undefined4 *)(lVar19 + lVar38);
            goto LAB_0018a6cb;
          }
        }
        if (*(char *)(lVar26 + 4 + lVar18) != '\0') goto LAB_0018a16a;
        *(undefined4 *)(lVar48 + lVar18 * 4) = *(undefined4 *)(lVar48 + -8 + lVar18 * 4);
        lVar27 = lVar27 + 0x200000000;
        lVar33 = lVar50 + lVar18;
        lVar18 = lVar18 + 2;
        if ((long)uVar16 <= lVar33 + 2) {
          iVar21 = iVar21 + (int)lVar18;
          uVar29 = iVar31 + (int)lVar18;
          break;
        }
      } while( true );
    }
    local_d8 = (ulong)uVar29;
    if (local_b0 < (int)uVar29) goto LAB_0018a0b4;
    if (*(char *)(lVar24 + local_d8) == '\0') {
      if (*(char *)(lVar1 + local_d8) == '\0') goto LAB_0018a14c;
      if (*(char *)(lVar24 + 3 + (long)iVar21) != '\0') goto LAB_0018a0ec;
    }
    else {
LAB_0018a0ec:
      if (*(char *)(lVar32 + 3 + (long)iVar21) != '\0') {
        if (*(char *)(lVar40 + local_d8) == '\0') {
          uVar29 = *(uint *)(lVar43 + local_d8 * 4);
          uVar11 = *(uint *)(lVar19 + (long)iVar21 * 4);
          goto LAB_0018a111;
        }
LAB_0018a9cd:
        lVar24 = (long)(int)local_d8;
        if (*(char *)(lVar24 + -2 + lVar32) != '\0') goto LAB_0018a9dc;
LAB_0018a9f3:
        uVar29 = *(uint *)(lVar43 + lVar24 * 4);
        goto LAB_0018b22e;
      }
    }
    uVar29 = *(uint *)(lVar19 + (long)iVar21 * 4);
    goto LAB_0018b17d;
  }
  if (local_b0 < iVar31) {
LAB_0018a0b4:
    local_d8 = (ulong)(int)local_d8;
    if (*(char *)(lVar24 + local_d8) == '\0') {
LAB_0018a0c2:
      if (*(char *)(lVar1 + local_d8) == '\0') goto LAB_0018a0cc;
    }
LAB_0018a7b6:
    uVar17 = *(undefined4 *)(lVar19 + -8 + local_d8 * 4);
    goto LAB_0018b274;
  }
  uVar47 = local_d8 & 0xffffffff;
  if (*(char *)(lVar24 + uVar47) == '\0') {
    if (*(char *)(lVar1 + uVar47) == '\0') {
LAB_0018a14c:
      uVar29 = (uint)local_d8;
      local_d8 = (ulong)(int)uVar29;
      if (*(char *)(local_d8 + 1 + lVar24) == '\0') goto LAB_00188885;
      cVar3 = *(char *)(lVar32 + 1 + local_d8);
      goto joined_r0x0018a15f;
    }
    if (*(char *)(lVar24 + 3 + lVar50) != '\0') goto LAB_00188d73;
  }
  else {
LAB_00188d73:
    if (*(char *)(lVar32 + 3 + lVar50) != '\0') {
      if (*(char *)(lVar40 + uVar47) == '\0') {
LAB_001898eb:
        local_d8 = uVar47;
        uVar29 = *(uint *)(lVar43 + local_d8 * 4);
        uVar11 = *(uint *)(lVar19 + lVar50 * 4);
        goto LAB_0018a111;
      }
LAB_0018a9dc:
      lVar24 = (long)(int)local_d8;
      cVar3 = *(char *)(lVar40 + -1 + lVar24);
      goto LAB_0018b21e;
    }
  }
LAB_0018a9e9:
  local_d8 = uVar47;
  uVar29 = *(uint *)(lVar19 + lVar50 * 4);
  goto LAB_0018b17d;
LAB_0018a16a:
  local_d8 = lVar50 + lVar18;
  if (((*(char *)(lVar40 + 3 + lVar33) == '\0') ||
      (*(char *)(lVar18 + 2 + lVar25 * lVar49 + lVar20 + lVar45) == '\0')) ||
     (*(char *)(lVar32 + lVar33) == '\0')) {
    uVar29 = TTA::Merge(*(uint *)(lVar2 * lVar49 + lVar20 * 4 + lVar35 + 0x10 + lVar18 * 4),
                        *(uint *)(lVar19 + lVar33 * 4));
    *(uint *)(lVar48 + lVar18 * 4) = uVar29;
  }
  else {
    uVar41 = lVar27 + 0x200000000 >> 0x20;
LAB_0018a1c7:
    local_d8 = local_d8 & 0xffffffff;
    uVar29 = *(uint *)(lVar43 + 8 + uVar41 * 4);
    if (*(char *)(lVar40 + -1 + uVar41) == '\0') {
      uVar29 = TTA::Merge(uVar29,*(uint *)(lVar19 + -8 + uVar41 * 4));
      *(uint *)(lVar19 + uVar41 * 4) = uVar29;
    }
    else {
      *(uint *)(lVar19 + uVar41 * 4) = uVar29;
    }
  }
LAB_00189b81:
  iVar21 = (int)local_d8;
  uVar29 = iVar21 + 2;
  if (local_b0 <= (int)uVar29) {
LAB_00189db1:
    local_d8 = (ulong)uVar29;
    if (local_b0 < (int)uVar29) goto LAB_0018a0b4;
    if (*(char *)(lVar24 + local_d8) == '\0') {
      lVar45 = (long)iVar21;
      cVar3 = *(char *)(lVar24 + 3 + lVar45);
      if (*(char *)(lVar1 + local_d8) == '\0') {
        if (cVar3 == '\0') goto LAB_00188885;
        goto LAB_0018851e;
      }
      if (cVar3 == '\0') goto LAB_0018b26f;
    }
    lVar45 = (long)iVar21;
    if (*(char *)(lVar32 + 3 + lVar45) == '\0') goto LAB_0018b26f;
    goto LAB_0018851e;
  }
  lVar27 = (long)iVar21;
  lVar26 = lVar27 << 0x20;
  lVar46 = lVar36 + lVar27 + lVar45;
  lVar48 = lVar46 + 3;
  lVar20 = lVar25 * lVar34 + lVar27 + lVar45;
  lVar23 = lVar2 * lVar49 + lVar27 * 4 + lVar35;
  lVar14 = lVar23 + 8;
  lVar50 = lVar13 + lVar27 * 4;
  lVar18 = lVar35 + lVar50 + 8;
  lVar33 = 0;
LAB_00189c6b:
  lVar38 = lVar26 >> 0x1e;
  iVar31 = (int)(lVar27 + 2);
  iVar42 = (int)lVar33;
  if (*(char *)(lVar46 + 2 + lVar33) == '\0') {
    if (*(char *)(lVar25 * lVar30 + lVar27 + lVar45 + 2 + lVar33) == '\0') {
      local_d8 = lVar27 + 2 + lVar33;
      lVar50 = lVar26 + 0x300000000 >> 0x20;
      if (*(char *)(lVar24 + lVar50) == '\0') {
        iVar31 = (int)local_d8;
        goto LAB_0018871f;
      }
      if (*(char *)(lVar32 + lVar50) != '\0') {
        uVar17 = *(undefined4 *)(lVar14 + lVar33 * 4);
LAB_00189f28:
        *(undefined4 *)(lVar18 + lVar33 * 4) = uVar17;
        goto LAB_0018999c;
      }
      if (*(char *)(lVar32 + 4 + (lVar26 >> 0x20)) == '\0') {
        *(undefined4 *)(lVar18 + lVar33 * 4) = *(undefined4 *)(lVar14 + lVar33 * 4);
        local_d8 = local_d8 & 0xffffffff;
        goto LAB_00188d00;
      }
      local_d8 = local_d8 & 0xffffffff;
LAB_0018861f:
      lVar50 = (long)(int)local_d8;
      if (*(char *)(lVar40 + 1 + lVar50) == '\0') {
        uVar29 = TTA::Merge(*(uint *)(lVar43 + lVar50 * 4),*(uint *)(lVar43 + 8 + lVar50 * 4));
      }
      else {
        uVar29 = *(uint *)(lVar43 + 8 + lVar50 * 4);
      }
LAB_001886c2:
      *(uint *)(lVar19 + lVar50 * 4) = uVar29;
      goto LAB_00189b81;
    }
    if (*(char *)(lVar48 + lVar33) == '\0') {
      uVar29 = iVar31 + iVar42;
      *(undefined4 *)(lVar50 + lVar35 + 8 + lVar33 * 4) = *(undefined4 *)(lVar19 + lVar38);
      goto LAB_0018a35e;
    }
    if (*(char *)(lVar20 + 3 + lVar33) != '\0') {
      local_d8 = (ulong)(uint)(iVar31 + iVar42);
      uVar17 = *(undefined4 *)(lVar14 + lVar33 * 4);
      goto LAB_00189f28;
    }
  }
  else {
    if (*(char *)(lVar20 + 3 + lVar33) != '\0') {
      local_d8 = (ulong)(uint)(iVar31 + iVar42);
      *(undefined4 *)(lVar18 + lVar33 * 4) = *(undefined4 *)(lVar14 + lVar33 * 4);
      goto LAB_0018af8c;
    }
    if (*(char *)(lVar48 + lVar33) == '\0') goto LAB_00189e69;
  }
  if (*(char *)(lVar20 + 4 + lVar33) == '\0') {
    *(undefined4 *)(lVar50 + lVar35 + 8 + lVar33 * 4) = *(undefined4 *)(lVar19 + lVar38);
    local_d8 = (ulong)(uint)(iVar31 + iVar42);
    goto LAB_00189f8b;
  }
  uVar29 = *(uint *)(lVar23 + 0x10 + lVar33 * 4);
  if (*(char *)(lVar25 * lVar49 + lVar27 + lVar45 + 3 + lVar33) == '\0') {
    uVar29 = TTA::Merge(uVar29,*(uint *)(lVar35 + lVar50 + lVar33 * 4));
  }
  *(uint *)(lVar18 + lVar33 * 4) = uVar29;
  lVar26 = lVar26 + 0x200000000;
  lVar38 = lVar27 + lVar33;
  lVar33 = lVar33 + 2;
  if ((long)uVar16 <= lVar38 + 4) {
    iVar21 = iVar21 + (int)lVar33;
    uVar29 = iVar31 + (int)lVar33;
    goto LAB_00189db1;
  }
  goto LAB_00189c6b;
LAB_00189e69:
  iVar31 = iVar31 + iVar42;
  *(undefined4 *)(lVar50 + lVar35 + 8 + lVar33 * 4) = *(undefined4 *)(lVar19 + lVar38);
LAB_0018a6cb:
  lVar50 = (long)iVar31;
  local_d8 = lVar50 + 2;
  if ((int)local_d8 < local_b0) {
    if (*(char *)(lVar24 + local_d8) != '\0') {
      if (*(char *)(lVar1 + 1 + lVar50) == '\0') goto LAB_001884dd;
      if (*(char *)(lVar50 + 3 + lVar32) == '\0') {
        if (*(char *)(lVar24 + 3 + lVar50) == '\0') {
          if (*(char *)(lVar32 + local_d8) == '\0') goto LAB_0018abd4;
          if (*(char *)(lVar32 + lVar50) != '\0') goto LAB_0018abb9;
          uVar29 = TTA::Merge(*(uint *)(lVar43 + 8 + lVar50 * 4),*(uint *)(lVar19 + lVar50 * 4));
          *(uint *)(lVar19 + 8 + lVar50 * 4) = uVar29;
          goto LAB_00189716;
        }
        goto LAB_0018aa4b;
      }
      if (*(char *)(lVar32 + lVar50) == '\0') {
        uVar29 = TTA::Merge(*(uint *)(lVar43 + 8 + lVar50 * 4),*(uint *)(lVar19 + lVar50 * 4));
        *(uint *)(lVar19 + 8 + lVar50 * 4) = uVar29;
      }
      else {
LAB_0018a708:
        if (*(char *)(lVar40 + -1 + local_d8) != '\0') goto LAB_0018a63d;
        uVar29 = TTA::Merge(*(uint *)(lVar43 + local_d8 * 4),*(uint *)(lVar19 + -8 + local_d8 * 4));
        *(uint *)(lVar19 + local_d8 * 4) = uVar29;
      }
      goto LAB_0018af8c;
    }
    if (*(char *)(lVar1 + local_d8) == '\0') goto LAB_0018a952;
    if (*(char *)(lVar50 + 3 + lVar24) == '\0') goto LAB_00189042;
    if (*(char *)(lVar1 + 1 + lVar50) == '\0') goto LAB_001885ee;
    if (*(char *)(lVar32 + 3 + lVar50) != '\0') {
      if (*(char *)(lVar32 + lVar50) != '\0') goto LAB_0018a8d8;
      uVar29 = TTA::Merge(*(uint *)(lVar43 + 8 + lVar50 * 4),*(uint *)(lVar19 + lVar50 * 4));
      *(uint *)(lVar19 + 8 + lVar50 * 4) = uVar29;
      goto LAB_0018999c;
    }
LAB_0018aa4b:
    if (*(char *)(lVar50 + 4 + lVar32) == '\0') {
      if (*(char *)(lVar32 + 2 + lVar50) == '\0') {
LAB_0018ac12:
        *(undefined4 *)(lVar19 + 8 + lVar50 * 4) = *(undefined4 *)(lVar19 + lVar50 * 4);
        local_d8 = local_d8 & 0xffffffff;
LAB_00189841:
        do {
          lVar50 = (long)(int)local_d8;
          local_d8 = lVar50 + 2;
          iVar31 = (int)local_d8;
          if (local_b0 <= iVar31) {
            if (local_b0 < iVar31) goto LAB_0018a0b4;
            uVar47 = local_d8 & 0xffffffff;
            if (*(char *)(lVar24 + uVar47) == '\0') {
              if (*(char *)(lVar1 + uVar47) == '\0') goto LAB_0018a14c;
              if (*(char *)(lVar24 + 3 + lVar50) == '\0') goto LAB_0018a9e9;
            }
            if (*(char *)(lVar32 + 3 + lVar50) == '\0') goto LAB_0018a9e9;
            goto LAB_001898eb;
          }
          if (*(char *)(lVar24 + local_d8) != '\0') {
            if (*(char *)(lVar50 + 3 + lVar32) != '\0') {
              uVar29 = TTA::Merge(*(uint *)(lVar43 + 8 + lVar50 * 4),*(uint *)(lVar19 + lVar50 * 4))
              ;
              *(uint *)(lVar19 + 8 + lVar50 * 4) = uVar29;
              goto LAB_0018af8c;
            }
            if (*(char *)(lVar24 + 3 + lVar50) == '\0') {
              *(undefined4 *)(lVar19 + 8 + lVar50 * 4) = *(undefined4 *)(lVar19 + lVar50 * 4);
              goto LAB_0018a6cb;
            }
LAB_00189a4a:
            if (*(char *)(lVar50 + 4 + lVar32) == '\0') {
              *(undefined4 *)(lVar19 + 8 + lVar50 * 4) = *(undefined4 *)(lVar19 + lVar50 * 4);
              goto LAB_00189b77;
            }
            uVar29 = TTA::Merge(*(uint *)(lVar43 + 0x10 + lVar50 * 4),*(uint *)(lVar19 + lVar50 * 4)
                               );
            *(uint *)(lVar19 + 8 + lVar50 * 4) = uVar29;
            goto LAB_00189b81;
          }
          if (*(char *)(lVar1 + local_d8) == '\0') {
LAB_0018997d:
            iVar31 = (int)local_d8;
            lVar50 = (long)iVar31;
            if (*(char *)(lVar50 + 1 + lVar24) == '\0') goto LAB_0018871f;
            if (*(char *)(lVar32 + 1 + lVar50) != '\0') goto LAB_00189993;
            if (*(char *)(lVar50 + 2 + lVar32) != '\0') {
              *(undefined4 *)(lVar19 + lVar50 * 4) = *(undefined4 *)(lVar43 + 8 + lVar50 * 4);
              local_d8 = local_d8 & 0xffffffff;
              goto LAB_00189b81;
            }
            uVar41 = (ulong)TTA::length_;
            TTA::rtable_[uVar41] = TTA::length_;
            TTA::next_[uVar41] = 0xffffffff;
            TTA::tail_[TTA::length_] = TTA::length_;
            uVar29 = TTA::length_ + 1;
            *(uint *)(lVar19 + lVar50 * 4) = TTA::length_;
            TTA::length_ = uVar29;
            local_d8 = local_d8 & 0xffffffff;
          }
          else {
            if (*(char *)(lVar50 + 3 + lVar24) == '\0') goto LAB_00189ac2;
            if (*(char *)(lVar32 + 3 + lVar50) == '\0') goto LAB_00189a4a;
            uVar29 = TTA::Merge(*(uint *)(lVar43 + 8 + lVar50 * 4),*(uint *)(lVar19 + lVar50 * 4));
            *(uint *)(lVar19 + 8 + lVar50 * 4) = uVar29;
LAB_0018999c:
            lVar50 = (long)(int)local_d8;
            local_d8 = lVar50 + 2;
            uVar29 = (uint)local_d8;
            if (local_b0 <= (int)uVar29) {
              if (local_b0 < (int)uVar29) {
                local_d8 = local_d8 & 0xffffffff;
                goto LAB_0018a0b4;
              }
              local_d8 = local_d8 & 0xffffffff;
              if (*(char *)(lVar24 + local_d8) != '\0') goto LAB_0018b1f8;
              if (*(char *)(lVar1 + local_d8) == '\0') goto LAB_0018b4ce;
              if (*(char *)(lVar24 + 3 + lVar50) != '\0') goto LAB_0018b1f8;
              *(undefined4 *)(lVar19 + local_d8 * 4) = *(undefined4 *)(lVar19 + lVar50 * 4);
              goto LAB_0018b2bb;
            }
            if (*(char *)(lVar24 + local_d8) != '\0') goto LAB_0018a626;
            if (*(char *)(lVar1 + local_d8) == '\0') goto LAB_001885dc;
            if (*(char *)(lVar24 + 3 + lVar50) != '\0') {
              uVar47 = local_d8;
              uVar41 = local_d8 & 0xffffffff;
LAB_0018b36f:
              local_d8 = uVar41 & 0xffffffff;
              if (*(char *)(lVar32 + 1 + uVar47) != '\0') goto LAB_0018b37d;
              goto LAB_0018a65c;
            }
            *(undefined4 *)(lVar19 + 8 + lVar50 * 4) = *(undefined4 *)(lVar19 + lVar50 * 4);
LAB_001890a6:
            lVar50 = (long)(int)local_d8;
            uVar41 = lVar50 + 2;
            iVar31 = (int)uVar41;
            if (local_b0 <= iVar31) {
              uVar47 = uVar41 & 0xffffffff;
              if (local_b0 < iVar31) {
                if (*(char *)(lVar24 + uVar47) == '\0') {
                  local_d8 = uVar41 & 0xffffffff;
                  goto LAB_0018a79e;
                }
                if (*(char *)(lVar1 + 1 + lVar50) == '\0') goto LAB_00189288;
LAB_001891d3:
                local_d8 = (ulong)iVar31;
                if (*(char *)(lVar32 + -1 + local_d8) == '\0') {
LAB_001892ec:
                  if (*(char *)(lVar32 + local_d8) != '\0') goto LAB_001892f3;
                  uVar29 = *(uint *)(lVar19 + -8 + local_d8 * 4);
                  goto LAB_0018b17d;
                }
                uVar29 = *(uint *)(lVar43 + -8 + local_d8 * 4);
              }
              else {
                if (*(char *)(lVar24 + uVar47) != '\0') {
                  if (*(char *)(lVar1 + 1 + lVar50) == '\0') {
LAB_00189261:
                    local_d8 = (ulong)(int)uVar41;
                    if (*(char *)(lVar32 + 1 + local_d8) != '\0') {
                      if ((*(char *)(lVar32 + local_d8) != '\0') ||
                         (*(char *)(lVar32 + -1 + local_d8) == '\0')) goto LAB_0018b179;
                      goto LAB_0018b169;
                    }
LAB_00189288:
                    local_d8 = (ulong)(int)uVar41;
                    if (*(char *)(lVar32 + local_d8) != '\0') goto LAB_0018851e;
                    if (*(char *)(lVar32 + -1 + local_d8) == '\0') goto LAB_0018b27b;
                    uVar17 = *(undefined4 *)(lVar43 + -8 + local_d8 * 4);
                    goto LAB_0018b274;
                  }
LAB_001891af:
                  local_d8 = (ulong)iVar31;
                  if (*(char *)(lVar32 + 1 + local_d8) == '\0') goto LAB_001891d3;
                  if ((*(char *)(lVar32 + local_d8) != '\0') ||
                     (*(char *)(lVar32 + -1 + local_d8) == '\0')) {
                    uVar29 = *(uint *)(lVar43 + local_d8 * 4);
                    goto LAB_001892fc;
                  }
                  if (*(char *)(lVar40 + local_d8) == '\0') {
                    uVar29 = TTA::Merge(*(uint *)(lVar43 + -8 + local_d8 * 4),
                                        *(uint *)(lVar43 + local_d8 * 4));
                    uVar11 = *(uint *)(lVar19 + -8 + local_d8 * 4);
                  }
                  else {
                    uVar29 = *(uint *)(lVar43 + local_d8 * 4);
                    uVar11 = *(uint *)(lVar19 + -8 + local_d8 * 4);
                  }
                  uVar29 = TTA::Merge(uVar29,uVar11);
                  *(uint *)(lVar19 + local_d8 * 4) = uVar29;
                  goto LAB_0018b2bb;
                }
LAB_001892bc:
                iVar31 = (int)uVar41;
                if (*(char *)(lVar1 + uVar47) == '\0') goto LAB_00188871;
                local_d8 = (ulong)iVar31;
                if (*(char *)(lVar24 + 1 + local_d8) == '\0') goto LAB_0018a7a8;
LAB_001892d6:
                uVar29 = (uint)uVar41;
                if (*(char *)(lVar1 + -1 + local_d8) == '\0') goto LAB_0018849e;
LAB_001892e4:
                if (*(char *)(lVar32 + 1 + local_d8) == '\0') goto LAB_001892ec;
LAB_001892f3:
                uVar29 = *(uint *)(lVar43 + local_d8 * 4);
              }
LAB_001892fc:
              uVar11 = *(uint *)(lVar19 + -8 + local_d8 * 4);
              goto LAB_0018a111;
            }
            if (*(char *)(lVar24 + uVar41) != '\0') {
              local_d8 = uVar41;
              if (*(char *)(lVar1 + 1 + lVar50) != '\0') goto LAB_001890d3;
LAB_001888fc:
              iVar31 = (int)local_d8;
              lVar50 = (long)iVar31;
              if (*(char *)(lVar50 + 1 + lVar32) != '\0') {
                if ((*(char *)(lVar32 + lVar50) != '\0') ||
                   (*(char *)(lVar32 + -1 + lVar50) == '\0')) {
                  *(undefined4 *)(lVar19 + lVar50 * 4) = *(undefined4 *)(lVar43 + lVar50 * 4);
                  local_d8 = local_d8 & 0xffffffff;
                  goto LAB_0018af8c;
                }
                local_d8 = local_d8 & 0xffffffff;
                goto LAB_0018b450;
              }
              if (*(char *)(lVar24 + 1 + lVar50) == '\0') {
                lVar50 = (long)iVar31;
                if (*(char *)(lVar32 + lVar50) != '\0') {
                  *(undefined4 *)(lVar19 + lVar50 * 4) = *(undefined4 *)(lVar43 + lVar50 * 4);
                  goto LAB_00189716;
                }
                if (*(char *)(lVar32 + -1 + lVar50) != '\0') {
                  *(undefined4 *)(lVar19 + lVar50 * 4) = *(undefined4 *)(lVar43 + -8 + lVar50 * 4);
                  goto LAB_00188a84;
                }
                uVar41 = (ulong)TTA::length_;
                TTA::rtable_[uVar41] = TTA::length_;
                TTA::next_[uVar41] = 0xffffffff;
                TTA::tail_[TTA::length_] = TTA::length_;
                uVar29 = TTA::length_ + 1;
                *(uint *)(lVar19 + lVar50 * 4) = TTA::length_;
                TTA::length_ = uVar29;
                goto LAB_00188a84;
              }
              uVar47 = (ulong)iVar31;
              if (*(char *)(lVar32 + 2 + uVar47) != '\0') {
                if (*(char *)(lVar32 + uVar47) != '\0') goto LAB_0018861f;
                if (*(char *)(lVar32 + -1 + uVar47) != '\0') goto LAB_0018b6cd;
                goto LAB_0018a690;
              }
              if (*(char *)(lVar32 + uVar47) != '\0') {
                *(undefined4 *)(lVar19 + uVar47 * 4) = *(undefined4 *)(lVar43 + uVar47 * 4);
                goto LAB_00188d00;
              }
              if (*(char *)(lVar32 + -1 + uVar47) == '\0') {
                uVar41 = (ulong)TTA::length_;
                TTA::rtable_[uVar41] = TTA::length_;
                TTA::next_[uVar41] = 0xffffffff;
                TTA::tail_[TTA::length_] = TTA::length_;
                uVar29 = TTA::length_ + 1;
                *(uint *)(lVar19 + uVar47 * 4) = TTA::length_;
                TTA::length_ = uVar29;
              }
              else {
                *(undefined4 *)(lVar19 + uVar47 * 4) = *(undefined4 *)(lVar43 + -8 + uVar47 * 4);
              }
              goto LAB_00189841;
            }
LAB_00188b83:
            local_d8 = uVar41 & 0xffffffff;
            uVar41 = (ulong)(int)uVar41;
            if (*(char *)(lVar1 + uVar41) == '\0') {
LAB_001885dc:
              while( true ) {
                iVar31 = (int)local_d8;
                local_d8 = local_d8 & 0xffffffff;
                if (*(char *)(lVar24 + 1 + (long)iVar31) != '\0') break;
LAB_0018871f:
                lVar50 = (long)iVar31;
                if (*(char *)(lVar1 + 1 + lVar50) == '\0') {
                  *(undefined4 *)(lVar19 + lVar50 * 4) = 0;
                  uVar41 = lVar50 + 2;
                  if (local_b0 <= (int)uVar41) {
                    cVar3 = *(char *)(lVar24 + (uVar41 & 0xffffffff));
                    if (local_b0 < (int)uVar41) {
                      if (cVar3 != '\0') goto LAB_00189288;
                      goto LAB_001887f7;
                    }
                    if (cVar3 != '\0') goto LAB_00189261;
                    goto LAB_00188855;
                  }
                  local_d8 = uVar41;
                  if (*(char *)(lVar24 + uVar41) != '\0') goto LAB_001888fc;
LAB_001885a6:
                  local_d8 = uVar41;
                  lVar50 = (long)(int)local_d8;
                  if (*(char *)(lVar1 + lVar50) != '\0') {
                    if (*(char *)(lVar24 + 1 + lVar50) == '\0') goto LAB_0018905c;
                    local_d8 = local_d8 & 0xffffffff;
                    break;
                  }
                }
                else {
                  uVar41 = (ulong)TTA::length_;
                  TTA::rtable_[uVar41] = TTA::length_;
                  TTA::next_[uVar41] = 0xffffffff;
                  uVar29 = TTA::length_;
                  TTA::tail_[TTA::length_] = TTA::length_;
                  uVar11 = TTA::length_ + 1;
                  *(uint *)(lVar19 + lVar50 * 4) = TTA::length_;
                  TTA::length_ = uVar11;
                  uVar41 = lVar50 + 2;
                  iVar31 = (int)uVar41;
                  if (local_b0 <= iVar31) {
                    uVar47 = uVar41 & 0xffffffff;
                    if (local_b0 < iVar31) {
                      if (*(char *)(lVar24 + uVar47) != '\0') goto LAB_001891d3;
                      local_d8 = (ulong)iVar31;
                      goto LAB_0018a0c2;
                    }
                    if (*(char *)(lVar24 + uVar47) != '\0') goto LAB_001891af;
                    if (*(char *)(lVar1 + uVar47) == '\0') goto LAB_00188871;
                    if (*(char *)(lVar24 + 3 + lVar50) == '\0') {
                      *(uint *)(lVar19 + uVar47 * 4) = uVar29;
                      goto LAB_0018b2bb;
                    }
                    local_d8 = (ulong)iVar31;
                    goto LAB_001892e4;
                  }
                  if (*(char *)(lVar24 + uVar41) != '\0') {
                    local_d8 = uVar41 & 0xffffffff;
LAB_001890d3:
                    iVar31 = (int)local_d8;
                    lVar50 = (long)iVar31;
                    if (*(char *)(lVar50 + 1 + lVar32) != '\0') {
                      if (*(char *)(lVar32 + lVar50) == '\0') {
                        if (*(char *)(lVar32 + -1 + lVar50) == '\0') {
                          uVar29 = TTA::Merge(*(uint *)(lVar43 + lVar50 * 4),
                                              *(uint *)(lVar19 + -8 + lVar50 * 4));
                          *(uint *)(lVar19 + lVar50 * 4) = uVar29;
                        }
                        else {
                          if (*(char *)(lVar40 + lVar50) == '\0') {
                            uVar29 = TTA::Merge(*(uint *)(lVar43 + -8 + lVar50 * 4),
                                                *(uint *)(lVar43 + lVar50 * 4));
                            uVar11 = *(uint *)(lVar19 + -8 + lVar50 * 4);
                          }
                          else {
                            uVar29 = *(uint *)(lVar43 + lVar50 * 4);
                            uVar11 = *(uint *)(lVar19 + -8 + lVar50 * 4);
                          }
                          uVar29 = TTA::Merge(uVar29,uVar11);
                          *(uint *)(lVar19 + lVar50 * 4) = uVar29;
                          local_d8 = local_d8 & 0xffffffff;
                        }
                      }
                      else {
                        uVar29 = TTA::Merge(*(uint *)(lVar43 + lVar50 * 4),
                                            *(uint *)(lVar19 + -8 + lVar50 * 4));
                        *(uint *)(lVar19 + lVar50 * 4) = uVar29;
                      }
                      goto LAB_0018af8c;
                    }
                    if (*(char *)(lVar24 + 1 + lVar50) == '\0') {
                      uVar41 = (ulong)iVar31;
                      uVar47 = local_d8;
                      if (*(char *)(lVar32 + -1 + uVar41) == '\0') {
                        do {
                          local_d8 = uVar47 & 0xffffffff;
                          iVar31 = (int)uVar47;
                          if (*(char *)(lVar32 + uVar41) == '\0') {
                            *(undefined4 *)(lVar19 + uVar41 * 4) =
                                 *(undefined4 *)(lVar19 + -8 + uVar41 * 4);
                          }
                          else {
                            uVar29 = TTA::Merge(*(uint *)(lVar43 + uVar41 * 4),
                                                *(uint *)(lVar19 + -8 + uVar41 * 4));
                            *(uint *)(lVar19 + uVar41 * 4) = uVar29;
LAB_00189716:
                            lVar50 = (long)(int)local_d8;
                            local_d8 = lVar50 + 2;
                            if (local_b0 <= (int)local_d8) {
                              uVar47 = local_d8 & 0xffffffff;
                              if (local_b0 < (int)local_d8) {
                                if (*(char *)(lVar24 + uVar47) == '\0') goto LAB_0018a79e;
                                if (*(char *)(lVar1 + 1 + lVar50) == '\0') goto LAB_0018a796;
                              }
                              else {
                                if (*(char *)(lVar24 + uVar47) == '\0') {
                                  if (*(char *)(lVar1 + uVar47) == '\0') goto LAB_0018aa34;
                                  if (*(char *)(lVar24 + 3 + lVar50) == '\0') goto LAB_0018aa2c;
                                }
                                if (*(char *)(lVar1 + 1 + lVar50) == '\0') goto LAB_0018a81c;
                                if (*(char *)(lVar32 + 3 + lVar50) != '\0') goto LAB_0018a804;
                              }
                              if (*(char *)(lVar32 + uVar47) == '\0') goto LAB_0018a9e9;
                              goto LAB_0018a9dc;
                            }
                            if (*(char *)(lVar24 + local_d8) == '\0') {
                              if (*(char *)(lVar1 + local_d8) == '\0') goto LAB_0018a952;
                              if (*(char *)(lVar50 + 3 + lVar24) == '\0') goto LAB_00189042;
                              if (*(char *)(lVar1 + 1 + lVar50) == '\0') goto LAB_001885ee;
                              if (*(char *)(lVar32 + 3 + lVar50) != '\0') goto LAB_0018a8d8;
LAB_001897e0:
                              if (*(char *)(lVar50 + 4 + lVar32) == '\0') {
                                uVar41 = local_d8;
                                if (*(char *)(lVar32 + local_d8) == '\0') goto LAB_0018ac12;
                                goto LAB_0018abf4;
                              }
                              uVar47 = local_d8;
                              if (*(char *)(lVar40 + 3 + lVar50) != '\0') goto LAB_0018aa70;
                              uVar41 = local_d8;
                              if (*(char *)(lVar32 + local_d8) != '\0') goto LAB_0018acfa;
                              goto LAB_0018ad35;
                            }
                            if (*(char *)(lVar1 + 1 + lVar50) == '\0') goto LAB_001884dd;
                            if (*(char *)(lVar50 + 3 + lVar32) != '\0') goto LAB_0018a708;
                            if (*(char *)(lVar24 + 3 + lVar50) != '\0') goto LAB_001897e0;
                            if (*(char *)(lVar32 + local_d8) != '\0') {
LAB_0018abb9:
                              uVar29 = *(uint *)(lVar43 + local_d8 * 4);
                              if (*(char *)(lVar40 + -1 + local_d8) == '\0') {
                                uVar29 = TTA::Merge(uVar29,*(uint *)(lVar19 + -8 + local_d8 * 4));
                                *(uint *)(lVar19 + local_d8 * 4) = uVar29;
                              }
                              else {
                                *(uint *)(lVar19 + local_d8 * 4) = uVar29;
                              }
                              goto LAB_00189716;
                            }
LAB_0018abd4:
                            iVar31 = (int)local_d8;
                            *(undefined4 *)(lVar19 + 8 + lVar50 * 4) =
                                 *(undefined4 *)(lVar19 + lVar50 * 4);
                          }
LAB_00188a84:
                          lVar50 = (long)iVar31;
                          uVar41 = lVar50 + 2;
                          iVar31 = (int)uVar41;
                          if (local_b0 <= iVar31) {
                            uVar47 = uVar41 & 0xffffffff;
                            if (iVar31 <= local_b0) {
                              if (*(char *)(lVar24 + uVar47) == '\0') goto LAB_001892bc;
                              local_d8 = (ulong)iVar31;
                              goto LAB_001892d6;
                            }
                            if (*(char *)(lVar24 + uVar47) == '\0') {
                              local_d8 = uVar41 & 0xffffffff;
                              goto LAB_0018a79e;
                            }
                            uVar47 = uVar41;
                            if (*(char *)(lVar1 + 1 + lVar50) == '\0') goto LAB_00188511;
                            local_d8 = (ulong)iVar31;
                            goto LAB_001892ec;
                          }
                          if (*(char *)(lVar24 + uVar41) == '\0') goto LAB_00188b83;
                          if (*(char *)(lVar1 + 1 + lVar50) == '\0') {
                            local_d8 = uVar41 & 0xffffffff;
                            goto LAB_001884dd;
                          }
                          if (*(char *)(lVar50 + 3 + lVar32) != '\0') {
                            uVar29 = TTA::Merge(*(uint *)(lVar43 + 8 + lVar50 * 4),
                                                *(uint *)(lVar19 + lVar50 * 4));
                            *(uint *)(lVar19 + 8 + lVar50 * 4) = uVar29;
                            local_d8 = uVar41 & 0xffffffff;
                            goto LAB_0018af8c;
                          }
                          local_d8 = uVar41;
                          uVar47 = uVar41;
                        } while (*(char *)(lVar24 + 3 + lVar50) == '\0');
                        goto LAB_00188c29;
                      }
                      uVar29 = TTA::Merge(*(uint *)(lVar43 + -8 + uVar41 * 4),
                                          *(uint *)(lVar19 + -8 + uVar41 * 4));
                      *(uint *)(lVar19 + uVar41 * 4) = uVar29;
                      goto LAB_0018a6cb;
                    }
                    if (*(char *)(lVar50 + 2 + lVar32) == '\0') {
                      if (*(char *)(lVar32 + -1 + lVar50) == '\0') goto LAB_00188ca7;
                      uVar29 = TTA::Merge(*(uint *)(lVar43 + -8 + lVar50 * 4),
                                          *(uint *)(lVar19 + -8 + lVar50 * 4));
                      *(uint *)(lVar19 + lVar50 * 4) = uVar29;
                      goto LAB_00189f8b;
                    }
                    if (*(char *)(lVar32 + lVar50) == '\0') {
                      if (*(char *)(lVar32 + -1 + lVar50) == '\0') {
                        uVar29 = TTA::Merge(*(uint *)(lVar43 + 8 + lVar50 * 4),
                                            *(uint *)(lVar19 + -8 + lVar50 * 4));
                        goto LAB_001886c2;
                      }
                      if (*(char *)(lVar40 + 1 + lVar50) == '\0') {
                        uVar29 = TTA::Merge(*(uint *)(lVar43 + -8 + lVar50 * 4),
                                            *(uint *)(lVar43 + 8 + lVar50 * 4));
                        uVar29 = TTA::Merge(uVar29,*(uint *)(lVar19 + -8 + lVar50 * 4));
                        *(uint *)(lVar19 + lVar50 * 4) = uVar29;
                      }
                      else {
                        if (*(char *)(lVar40 + lVar50) == '\0') {
                          uVar29 = TTA::Merge(*(uint *)(lVar43 + -8 + lVar50 * 4),
                                              *(uint *)(lVar43 + 8 + lVar50 * 4));
                          uVar11 = *(uint *)(lVar19 + -8 + lVar50 * 4);
                        }
                        else {
                          uVar29 = *(uint *)(lVar43 + 8 + lVar50 * 4);
                          uVar11 = *(uint *)(lVar19 + -8 + lVar50 * 4);
                        }
                        uVar29 = TTA::Merge(uVar29,uVar11);
                        *(uint *)(lVar19 + lVar50 * 4) = uVar29;
                      }
                    }
                    else {
                      if (*(char *)(lVar40 + 1 + lVar50) == '\0') {
                        uVar29 = TTA::Merge(*(uint *)(lVar43 + lVar50 * 4),
                                            *(uint *)(lVar43 + 8 + lVar50 * 4));
                        uVar11 = *(uint *)(lVar19 + -8 + lVar50 * 4);
                      }
                      else {
                        uVar29 = *(uint *)(lVar43 + 8 + lVar50 * 4);
                        uVar11 = *(uint *)(lVar19 + -8 + lVar50 * 4);
                      }
                      uVar29 = TTA::Merge(uVar29,uVar11);
                      *(uint *)(lVar19 + lVar50 * 4) = uVar29;
                    }
                    goto LAB_00189b81;
                  }
                  if (*(char *)(lVar1 + uVar41) != '\0') {
                    if (*(char *)(lVar24 + 3 + lVar50) == '\0') {
                      *(uint *)(lVar19 + 8 + lVar50 * 4) = uVar29;
                      local_d8 = uVar41 & 0xffffffff;
                      goto LAB_001890a6;
                    }
                    local_d8 = uVar41 & 0xffffffff;
                    goto LAB_00188ba7;
                  }
                  local_d8 = uVar41 & 0xffffffff;
                }
              }
              goto LAB_001885ee;
            }
            if (*(char *)(lVar24 + 1 + uVar41) == '\0') {
LAB_00189042:
              lVar50 = (long)(int)local_d8;
              if (*(char *)(lVar1 + -1 + lVar50) == '\0') {
LAB_0018905c:
                uVar41 = (ulong)TTA::length_;
                TTA::rtable_[uVar41] = TTA::length_;
                TTA::next_[uVar41] = 0xffffffff;
                TTA::tail_[TTA::length_] = TTA::length_;
                uVar29 = TTA::length_ + 1;
                *(uint *)(lVar19 + lVar50 * 4) = TTA::length_;
                TTA::length_ = uVar29;
              }
              else {
                *(undefined4 *)(lVar19 + lVar50 * 4) = *(undefined4 *)(lVar19 + -8 + lVar50 * 4);
              }
              goto LAB_001890a6;
            }
            if (*(char *)(lVar1 + -1 + uVar41) != '\0') goto LAB_00188ba7;
LAB_001885ee:
            lVar50 = (long)(int)local_d8;
            uVar41 = local_d8;
            if (*(char *)(lVar32 + 1 + lVar50) != '\0') {
LAB_00189993:
              *(undefined4 *)(lVar19 + lVar50 * 4) = *(undefined4 *)(lVar43 + lVar50 * 4);
              goto LAB_0018999c;
            }
LAB_00188604:
            local_d8 = uVar41 & 0xffffffff;
            lVar50 = (long)(int)uVar41;
            if (*(char *)(lVar32 + 2 + lVar50) != '\0') {
              if (*(char *)(lVar32 + lVar50) != '\0') goto LAB_0018861f;
              *(undefined4 *)(lVar19 + lVar50 * 4) = *(undefined4 *)(lVar43 + 8 + lVar50 * 4);
              goto LAB_00189b81;
            }
            if (*(char *)(lVar32 + lVar50) != '\0') {
              *(undefined4 *)(lVar19 + lVar50 * 4) = *(undefined4 *)(lVar43 + lVar50 * 4);
              goto LAB_00188d00;
            }
            uVar41 = (ulong)TTA::length_;
            TTA::rtable_[uVar41] = TTA::length_;
            TTA::next_[uVar41] = 0xffffffff;
            TTA::tail_[TTA::length_] = TTA::length_;
            uVar29 = TTA::length_ + 1;
            *(uint *)(lVar19 + lVar50 * 4) = TTA::length_;
            TTA::length_ = uVar29;
          }
        } while( true );
      }
      uVar41 = local_d8;
      if (*(char *)(lVar32 + lVar50) == '\0') {
        uVar29 = TTA::Merge(*(uint *)(lVar43 + 8 + lVar50 * 4),*(uint *)(lVar19 + lVar50 * 4));
        *(uint *)(lVar19 + 8 + lVar50 * 4) = uVar29;
      }
      else {
LAB_0018abf4:
        local_d8 = uVar41 & 0xffffffff;
        uVar29 = *(uint *)(lVar43 + uVar41 * 4);
        if (*(char *)(lVar40 + -1 + uVar41) == '\0') {
          uVar29 = TTA::Merge(uVar29,*(uint *)(lVar19 + -8 + uVar41 * 4));
          *(uint *)(lVar19 + uVar41 * 4) = uVar29;
        }
        else {
          *(uint *)(lVar19 + uVar41 * 4) = uVar29;
        }
      }
      goto LAB_00188d00;
    }
    if (*(char *)(lVar40 + 3 + lVar50) != '\0') {
      uVar47 = local_d8;
      if (*(char *)(lVar32 + lVar50) == '\0') {
        uVar29 = TTA::Merge(*(uint *)(lVar43 + 0x10 + lVar50 * 4),*(uint *)(lVar19 + lVar50 * 4));
        *(uint *)(lVar19 + 8 + lVar50 * 4) = uVar29;
        goto LAB_00189b81;
      }
LAB_0018aa70:
      local_d8 = uVar47 & 0xffffffff;
      if (*(char *)(lVar40 + -1 + uVar47) != '\0') goto LAB_0018a681;
      uVar29 = TTA::Merge(*(uint *)(lVar43 + 8 + uVar47 * 4),*(uint *)(lVar19 + -8 + uVar47 * 4));
      goto LAB_0018a695;
    }
    if (*(char *)(lVar32 + local_d8) == '\0') {
LAB_0018ad35:
      uVar29 = TTA::Merge(*(uint *)(lVar43 + 0x10 + lVar50 * 4),*(uint *)(lVar19 + lVar50 * 4));
      local_a8 = local_d8;
    }
    else {
      uVar41 = local_d8;
      if (*(char *)(lVar32 + lVar50) != '\0') {
LAB_0018acfa:
        local_d8 = uVar41 & 0xffffffff;
        if (*(char *)(lVar40 + -1 + uVar41) == '\0') {
          uVar29 = TTA::Merge(*(uint *)(lVar43 + uVar41 * 4),*(uint *)(lVar43 + 8 + uVar41 * 4));
          uVar11 = *(uint *)(lVar19 + -8 + uVar41 * 4);
        }
        else {
          uVar29 = *(uint *)(lVar43 + 8 + uVar41 * 4);
          uVar11 = *(uint *)(lVar19 + -8 + uVar41 * 4);
        }
        uVar29 = TTA::Merge(uVar29,uVar11);
        *(uint *)(lVar19 + uVar41 * 4) = uVar29;
        goto LAB_00189b81;
      }
      uVar29 = TTA::Merge(*(uint *)(lVar43 + 8 + lVar50 * 4),*(uint *)(lVar43 + 0x10 + lVar50 * 4));
      uVar29 = TTA::Merge(uVar29,*(uint *)(lVar19 + lVar50 * 4));
      local_a8 = local_d8;
    }
    *(uint *)(lVar19 + 8 + lVar50 * 4) = uVar29;
    local_d8 = local_a8;
    goto LAB_00189b81;
  }
  uVar47 = local_d8 & 0xffffffff;
  if (local_b0 < (int)local_d8) {
    if (*(char *)(lVar24 + uVar47) == '\0') {
LAB_0018a79e:
      iVar31 = (int)local_d8;
      if (*(char *)(lVar1 + uVar47) == '\0') {
        *(undefined4 *)(lVar19 + uVar47 * 4) = 0;
        goto LAB_0018b2bb;
      }
LAB_0018a7a8:
      local_d8 = (ulong)iVar31;
      if (*(char *)(lVar1 + -1 + local_d8) == '\0') goto LAB_0018b27b;
      goto LAB_0018a7b6;
    }
    if (*(char *)(lVar1 + 1 + lVar50) == '\0') {
LAB_0018a796:
      uVar47 = local_d8 & 0xffffffff;
      goto LAB_00188511;
    }
  }
  else {
    if (*(char *)(lVar24 + uVar47) == '\0') {
      if (*(char *)(lVar1 + uVar47) == '\0') {
LAB_0018aa34:
        uVar41 = local_d8 & 0xffffffff;
        goto LAB_00188871;
      }
      if (*(char *)(lVar24 + 3 + lVar50) == '\0') {
LAB_0018aa2c:
        iVar31 = (int)local_d8;
        goto LAB_0018a7a8;
      }
    }
    if (*(char *)(lVar1 + 1 + lVar50) == '\0') {
LAB_0018a81c:
      uVar29 = (uint)local_d8;
      goto LAB_0018849e;
    }
    if (*(char *)(lVar32 + 3 + lVar50) != '\0') {
      if (*(char *)(lVar32 + lVar50) == '\0') goto LAB_001898eb;
LAB_0018a804:
      lVar24 = (long)(int)local_d8;
      if (*(char *)(lVar40 + -1 + lVar24) == '\0') goto LAB_0018a9f3;
      goto LAB_0018b202;
    }
  }
  if (*(char *)(lVar32 + uVar47) != '\0') goto LAB_0018a9cd;
  goto LAB_0018a9e9;
LAB_0018a626:
  iVar31 = (int)local_d8;
  uVar47 = (ulong)iVar31;
  if (*(char *)(uVar47 + 1 + lVar32) != '\0') {
    local_d8 = local_d8 & 0xffffffff;
LAB_0018a63d:
    lVar50 = (long)(int)local_d8;
    if (*(char *)(lVar32 + lVar50) == '\0') {
      uVar29 = *(uint *)(lVar43 + lVar50 * 4);
      if (*(char *)(lVar40 + lVar50) == '\0') {
        uVar29 = TTA::Merge(uVar29,*(uint *)(lVar19 + -8 + lVar50 * 4));
        *(uint *)(lVar19 + lVar50 * 4) = uVar29;
      }
      else {
        *(uint *)(lVar19 + lVar50 * 4) = uVar29;
      }
    }
    else {
      *(undefined4 *)(lVar19 + lVar50 * 4) = *(undefined4 *)(lVar43 + lVar50 * 4);
    }
    goto LAB_0018af8c;
  }
  if (*(char *)(lVar24 + 1 + uVar47) != '\0') goto LAB_0018a65c;
  *(undefined4 *)(lVar19 + uVar47 * 4) = *(undefined4 *)(lVar19 + -8 + uVar47 * 4);
  goto LAB_0018a6cb;
LAB_0018a65c:
  if (*(char *)(lVar32 + 2 + uVar47) != '\0') {
LAB_0018a66c:
    if (*(char *)(lVar40 + 1 + uVar47) == '\0') {
      uVar29 = TTA::Merge(*(uint *)(lVar43 + 8 + uVar47 * 4),*(uint *)(lVar19 + -8 + uVar47 * 4));
      *(uint *)(lVar19 + uVar47 * 4) = uVar29;
    }
    else {
LAB_0018a681:
      if (*(char *)(lVar32 + uVar47) == '\0') {
        uVar29 = *(uint *)(lVar43 + 8 + uVar47 * 4);
        if (*(char *)(lVar40 + uVar47) == '\0') {
          uVar29 = TTA::Merge(uVar29,*(uint *)(lVar19 + -8 + uVar47 * 4));
          *(uint *)(lVar19 + uVar47 * 4) = uVar29;
        }
        else {
          *(uint *)(lVar19 + uVar47 * 4) = uVar29;
        }
      }
      else {
LAB_0018a690:
        uVar29 = *(uint *)(lVar43 + 8 + uVar47 * 4);
LAB_0018a695:
        *(uint *)(lVar19 + uVar47 * 4) = uVar29;
      }
    }
    goto LAB_00189b81;
  }
  *(undefined4 *)(lVar19 + uVar47 * 4) = *(undefined4 *)(lVar19 + -8 + uVar47 * 4);
  goto LAB_00189f8b;
LAB_0018b6cd:
  if ((*(char *)(lVar40 + 1 + uVar47) == '\0') || (*(char *)(lVar40 + uVar47) == '\0')) {
    uVar29 = TTA::Merge(*(uint *)(lVar43 + -8 + uVar47 * 4),*(uint *)(lVar43 + 8 + uVar47 * 4));
  }
  else {
    uVar29 = *(uint *)(lVar43 + 8 + uVar47 * 4);
  }
  *(uint *)(lVar19 + uVar47 * 4) = uVar29;
  goto LAB_00189b81;
LAB_0018a952:
  local_d8 = local_d8 & 0xffffffff;
  goto LAB_001885dc;
LAB_0018a8d8:
  uVar41 = local_d8;
  if (*(char *)(lVar40 + -1 + local_d8) == '\0') {
    uVar29 = TTA::Merge(*(uint *)(lVar43 + local_d8 * 4),*(uint *)(lVar19 + -8 + local_d8 * 4));
    *(uint *)(lVar19 + local_d8 * 4) = uVar29;
  }
  else {
LAB_0018b37d:
    lVar50 = (long)(int)uVar41;
    if (*(char *)(lVar32 + lVar50) == '\0') {
      uVar29 = *(uint *)(lVar43 + lVar50 * 4);
      if (*(char *)(lVar40 + lVar50) == '\0') {
        uVar29 = TTA::Merge(uVar29,*(uint *)(lVar19 + -8 + lVar50 * 4));
        *(uint *)(lVar19 + lVar50 * 4) = uVar29;
        local_d8 = uVar41;
      }
      else {
        *(uint *)(lVar19 + lVar50 * 4) = uVar29;
        local_d8 = uVar41;
      }
    }
    else {
      *(undefined4 *)(lVar19 + lVar50 * 4) = *(undefined4 *)(lVar43 + lVar50 * 4);
      local_d8 = uVar41;
    }
  }
  goto LAB_0018999c;
LAB_00188ba7:
  if (*(char *)(lVar32 + 1 + uVar41) == '\0') {
LAB_00188c29:
    lVar50 = (long)(int)local_d8;
    if (*(char *)(lVar50 + 2 + lVar32) != '\0') {
      if (*(char *)(lVar40 + 1 + lVar50) == '\0') {
        if (*(char *)(lVar32 + lVar50) == '\0') {
          uVar11 = *(uint *)(lVar43 + 8 + lVar50 * 4);
          uVar29 = *(uint *)(lVar19 + -8 + lVar50 * 4);
        }
        else {
          uVar11 = TTA::Merge(*(uint *)(lVar43 + lVar50 * 4),*(uint *)(lVar43 + 8 + lVar50 * 4));
          uVar29 = *(uint *)(lVar19 + -8 + lVar50 * 4);
        }
        uVar29 = TTA::Merge(uVar11,uVar29);
        *(uint *)(lVar19 + lVar50 * 4) = uVar29;
        local_d8 = local_d8 & 0xffffffff;
      }
      else {
        uVar29 = TTA::Merge(*(uint *)(lVar43 + 8 + lVar50 * 4),*(uint *)(lVar19 + -8 + lVar50 * 4));
        *(uint *)(lVar19 + lVar50 * 4) = uVar29;
        local_d8 = local_d8 & 0xffffffff;
      }
      goto LAB_00189b81;
    }
    local_d8 = local_d8 & 0xffffffff;
LAB_00188ca7:
    if (*(char *)(lVar32 + lVar50) != '\0') {
      uVar29 = TTA::Merge(*(uint *)(lVar43 + lVar50 * 4),*(uint *)(lVar19 + -8 + lVar50 * 4));
      *(uint *)(lVar19 + lVar50 * 4) = uVar29;
      goto LAB_00188d00;
    }
    *(undefined4 *)(lVar19 + lVar50 * 4) = *(undefined4 *)(lVar19 + -8 + lVar50 * 4);
    goto LAB_00189841;
  }
  uVar29 = TTA::Merge(*(uint *)(lVar43 + uVar41 * 4),*(uint *)(lVar19 + -8 + uVar41 * 4));
  *(uint *)(lVar19 + uVar41 * 4) = uVar29;
  goto LAB_0018999c;
code_r0x0018bf33:
  if (*(char *)(lVar1 + lVar46) == '\0') {
    uVar41 = (ulong)(uint)(iVar21 + iVar42);
    *(undefined4 *)(lVar24 + lVar46 * 4) = *(undefined4 *)(lVar37 + (lVar20 >> 0x1e));
    goto LAB_0018c09b;
  }
  uVar12 = *(uint *)(lVar19 + lVar46 * 4);
  if (*(char *)(lVar13 + lVar48 + lVar46) == '\0') {
    uVar12 = TTA::Merge(uVar12,*(uint *)(lVar24 + -8 + lVar46 * 4));
  }
  *(uint *)(lVar24 + lVar46 * 4) = uVar12;
  lVar20 = lVar20 + 0x200000000;
  lVar23 = lVar48 + lVar46;
  lVar46 = lVar46 + 2;
  if ((long)uVar16 <= lVar23 + 4) {
    uVar12 = iVar31 + (int)lVar46 + 2;
    iVar31 = iVar31 + (int)lVar46;
    goto LAB_0018c672;
  }
  goto LAB_0018bf10;
code_r0x0018c360:
  *(undefined4 *)(lVar48 + lVar20 * 4) = *(undefined4 *)(lVar1 + -8 + lVar20 * 4);
  lVar14 = lVar24 + lVar20;
  lVar20 = lVar20 + 2;
  if ((long)uVar16 <= lVar14 + 2) {
    iVar21 = iVar31 + (int)lVar20 + 2;
    iVar31 = iVar31 + (int)lVar20;
    goto LAB_0018c62a;
  }
  goto LAB_0018c33b;
LAB_0018be59:
  *(undefined4 *)(lVar37 + uVar47 * 4) = *(undefined4 *)(lVar25 + 8 + uVar47 * 4);
  uVar47 = uVar41;
  goto LAB_0018bea4;
}

Assistant:

void FirstScan()
	{
		const int h = img_.rows;
		const int w = img_.cols;

		e_rows = h & 0xfffffffe;
		o_rows = h % 2 == 1;
		e_cols = w & 0xfffffffe;
		o_cols = w % 2 == 1;

		LabelsSolver::Setup(); // Labels solver initialization

							   // We work with 2x2 blocks
							   // +-+-+-+
							   // |P|Q|R|
							   // +-+-+-+
							   // |S|X|
							   // +-+-+

							   // The pixels are named as follows
							   // +---+---+---+
							   // |a b|c d|e f|
							   // |g h|i j|k l|
							   // +---+---+---+
							   // |m n|o p|
							   // |q r|s t|
							   // +---+---+

							   // Pixels a, f, l, q are not needed, since we need to understand the
							   // the connectivity between these blocks and those pixels only matter
							   // when considering the outer connectivities

							   // A bunch of defines used to check if the pixels are foreground,
							   // without going outside the image limits.

							   // First scan

		// Define Conditions and Actions
		{
#define CONDITION_B img_row_prev_prev[c-1]>0
#define CONDITION_C img_row_prev_prev[c]>0
#define CONDITION_D img_row_prev_prev[c+1]>0
#define CONDITION_E img_row_prev_prev[c+2]>0

#define CONDITION_G img_row_prev[c-2]>0
#define CONDITION_H img_row_prev[c-1]>0
#define CONDITION_I img_row_prev[c]>0
#define CONDITION_J img_row_prev[c+1]>0
#define CONDITION_K img_row_prev[c+2]>0

#define CONDITION_M img_row[c-2]>0
#define CONDITION_N img_row[c-1]>0
#define CONDITION_O img_row[c]>0
#define CONDITION_P img_row[c+1]>0

#define CONDITION_R img_row_fol[c-1]>0
#define CONDITION_S img_row_fol[c]>0
#define CONDITION_T img_row_fol[c+1]>0

			// Action 1: No action
#define ACTION_1 img_labels_row[c] = 0; 
							   // Action 2: New label (the block has foreground pixels and is not connected to anything else)
#define ACTION_2 img_labels_row[c] = LabelsSolver::NewLabel(); 
							   //Action 3: Assign label of block P
#define ACTION_3 img_labels_row[c] = img_labels_row_prev_prev[c - 2];
							   // Action 4: Assign label of block Q 
#define ACTION_4 img_labels_row[c] = img_labels_row_prev_prev[c];
							   // Action 5: Assign label of block R
#define ACTION_5 img_labels_row[c] = img_labels_row_prev_prev[c + 2];
							   // Action 6: Assign label of block S
#define ACTION_6 img_labels_row[c] = img_labels_row[c - 2]; 
							   // Action 7: Merge labels of block P and Q
#define ACTION_7 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev_prev[c - 2], img_labels_row_prev_prev[c]);
							   //Action 8: Merge labels of block P and R
#define ACTION_8 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev_prev[c - 2], img_labels_row_prev_prev[c + 2]);
							   // Action 9 Merge labels of block P and S
#define ACTION_9 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev_prev[c - 2], img_labels_row[c - 2]);
							   // Action 10 Merge labels of block Q and R
#define ACTION_10 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev_prev[c], img_labels_row_prev_prev[c + 2]);
							   // Action 11: Merge labels of block Q and S
#define ACTION_11 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev_prev[c], img_labels_row[c - 2]);
							   // Action 12: Merge labels of block R and S
#define ACTION_12 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev_prev[c + 2], img_labels_row[c - 2]);
							   // Action 13: Merge labels of block P, Q and R
#define ACTION_13 img_labels_row[c] = LabelsSolver::Merge(LabelsSolver::Merge(img_labels_row_prev_prev[c - 2], img_labels_row_prev_prev[c]), img_labels_row_prev_prev[c + 2]);
							   // Action 14: Merge labels of block P, Q and S
#define ACTION_14 img_labels_row[c] = LabelsSolver::Merge(LabelsSolver::Merge(img_labels_row_prev_prev[c - 2], img_labels_row_prev_prev[c]), img_labels_row[c - 2]);
							   //Action 15: Merge labels of block P, R and S
#define ACTION_15 img_labels_row[c] = LabelsSolver::Merge(LabelsSolver::Merge(img_labels_row_prev_prev[c - 2], img_labels_row_prev_prev[c + 2]), img_labels_row[c - 2]);
							   //Action 16: labels of block Q, R and S
#define ACTION_16 img_labels_row[c] = LabelsSolver::Merge(LabelsSolver::Merge(img_labels_row_prev_prev[c], img_labels_row_prev_prev[c + 2]), img_labels_row[c - 2]);
		}

		if (h == 1) {
			// Single line
			// int r = 0;
			const unsigned char* const img_row = img_.ptr<unsigned char>(0);
			unsigned* const img_labels_row = img_labels_.ptr<unsigned>(0);
			int c = -2;
#include "labeling_bolelli_2019_forest_sl.inc.h"
		}
		else {
			// More than one line

			// First couple of lines
			{
				// int r = 0;
				const unsigned char* const img_row = img_.ptr<unsigned char>(0);
				const unsigned char* const img_row_fol = (unsigned char*)(((char*)img_row) + img_.step.p[0]);
				unsigned* const img_labels_row = img_labels_.ptr<unsigned>(0);
				int c = -2;

#include "labeling_bolelli_2019_forest_fl.inc.h"
			}

			// Every other line but the last one if image has an odd number of rows
			for (int r = 2; r < e_rows; r += 2) {
				// Get rows pointer
				const unsigned char* const img_row = img_.ptr<unsigned char>(r);
				const unsigned char* const img_row_prev = (unsigned char*)(((char*)img_row) - img_.step.p[0]);
				const unsigned char* const img_row_prev_prev = (unsigned char*)(((char*)img_row_prev) - img_.step.p[0]);
				const unsigned char* const img_row_fol = (unsigned char*)(((char*)img_row) + img_.step.p[0]);
				unsigned* const img_labels_row = img_labels_.ptr<unsigned>(r);
				unsigned* const img_labels_row_prev_prev = (unsigned*)(((char*)img_labels_row) - img_labels_.step.p[0] - img_labels_.step.p[0]);

				int c = -2;
				goto tree_0;

#include "labeling_bolelli_2019_forest.inc.h"
			}

			// Last line (in case the rows are odd)
			if (o_rows)
			{
				int r = h - 1;
				const unsigned char* const img_row = img_.ptr<unsigned char>(r);
				const unsigned char* const img_row_prev = (unsigned char*)(((char*)img_row) - img_.step.p[0]);
				const unsigned char* const img_row_prev_prev = (unsigned char*)(((char*)img_row_prev) - img_.step.p[0]);
				unsigned* const img_labels_row = img_labels_.ptr<unsigned>(r);
				unsigned* const img_labels_row_prev_prev = (unsigned*)(((char*)img_labels_row) - img_labels_.step.p[0] - img_labels_.step.p[0]);
				int c = -2;
#include "labeling_bolelli_2019_forest_ll.inc.h"
			}
		}


		// Undef Conditions and Actions
		{
#undef ACTION_1
#undef ACTION_2
#undef ACTION_3
#undef ACTION_4
#undef ACTION_5
#undef ACTION_6
#undef ACTION_7
#undef ACTION_8
#undef ACTION_9
#undef ACTION_10
#undef ACTION_11
#undef ACTION_12
#undef ACTION_13
#undef ACTION_14
#undef ACTION_15
#undef ACTION_16


#undef CONDITION_B
#undef CONDITION_C
#undef CONDITION_D
#undef CONDITION_E

#undef CONDITION_G
#undef CONDITION_H
#undef CONDITION_I
#undef CONDITION_J
#undef CONDITION_K

#undef CONDITION_M
#undef CONDITION_N
#undef CONDITION_O
#undef CONDITION_P

#undef CONDITION_R
#undef CONDITION_S
#undef CONDITION_T
		}
	}